

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RayK<8> *pRVar2;
  RayK<8> *pRVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCRayQueryContext *pRVar9;
  RTCFilterFunctionN p_Var10;
  size_t k;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [28];
  undefined1 auVar99 [28];
  undefined1 auVar100 [28];
  bool bVar101;
  int iVar102;
  float *vertices;
  long lVar103;
  ulong uVar104;
  long lVar105;
  undefined1 (*pauVar106) [32];
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  NodeRef root;
  undefined4 uVar110;
  ulong unaff_R14;
  ulong *puVar111;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar126;
  float fVar127;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 in_ZMM0 [64];
  float fVar128;
  float fVar143;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar158;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar157;
  float fVar160;
  float fVar162;
  float fVar164;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar159;
  float fVar161;
  float fVar163;
  float fVar165;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar175;
  float fVar177;
  float fVar179;
  float fVar181;
  float fVar183;
  float fVar185;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  float fVar184;
  float fVar186;
  float fVar187;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar194;
  float fVar195;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar199 [32];
  float fVar213;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar222 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar230;
  float fVar231;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  float fVar247;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar252;
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar254 [64];
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar256 [64];
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar264 [64];
  float fVar271;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar272 [32];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_6071;
  ulong local_6070;
  ulong local_6068;
  RTCFilterFunctionNArguments local_6060;
  RayK<8> *local_6030;
  uint local_6024;
  undefined1 local_6020 [4];
  undefined1 auStack_601c [8];
  float fStack_6014;
  float fStack_6010;
  float fStack_600c;
  float fStack_6008;
  undefined1 local_6000 [32];
  undefined1 local_5fe0 [56];
  undefined1 (*local_5fa8) [32];
  long local_5fa0;
  undefined1 auStack_5f98 [24];
  undefined1 local_5f80 [8];
  float fStack_5f78;
  float fStack_5f74;
  float fStack_5f70;
  float fStack_5f6c;
  float fStack_5f68;
  undefined1 local_5f60 [20];
  uint uStack_5f4c;
  uint uStack_5f48;
  uint uStack_5f44;
  BVH *local_5f40;
  Intersectors *local_5f38;
  ulong local_5f30;
  Scene *local_5f28;
  undefined1 local_5f20 [32];
  undefined1 local_5f00 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ee0;
  undefined1 local_5e80 [32];
  undefined1 local_5e60 [32];
  undefined1 local_5e40 [32];
  undefined1 local_5e20 [16];
  undefined1 local_5e10 [16];
  uint local_5e00;
  uint uStack_5dfc;
  uint uStack_5df8;
  uint uStack_5df4;
  uint uStack_5df0;
  uint uStack_5dec;
  uint uStack_5de8;
  uint uStack_5de4;
  uint local_5de0;
  uint uStack_5ddc;
  uint uStack_5dd8;
  uint uStack_5dd4;
  uint uStack_5dd0;
  uint uStack_5dcc;
  uint uStack_5dc8;
  uint uStack_5dc4;
  undefined1 local_5dc0 [32];
  undefined1 local_5da0 [32];
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [8];
  float fStack_5d18;
  float fStack_5d14;
  float fStack_5d10;
  float fStack_5d0c;
  float fStack_5d08;
  undefined4 uStack_5d04;
  undefined1 local_5d00 [8];
  float fStack_5cf8;
  float fStack_5cf4;
  float fStack_5cf0;
  float fStack_5cec;
  float fStack_5ce8;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5c40;
  RTCRayQueryContext local_5c20 [4];
  RTCRayN local_5c00 [32];
  int local_5be0 [8];
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b80;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [8];
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  float fStack_58c4;
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  float fStack_58a4;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  float fStack_5884;
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar156 [64];
  undefined1 auVar200 [64];
  undefined1 auVar253 [36];
  
  local_5f40 = (BVH *)This->ptr;
  local_5808 = (local_5f40->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar146 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar144 = vpcmpeqd_avx(auVar146,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar146 = vpcmpeqd_avx(auVar146,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar145 = ZEXT816(0) << 0x40;
      auVar147 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar145),5);
      auVar169._16_16_ = auVar146;
      auVar169._0_16_ = auVar144;
      auVar129 = auVar169 & auVar147;
      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar129 >> 0x7f,0) != '\0') ||
            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar129 >> 0xbf,0) != '\0') ||
          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar129[0x1f] < '\0') {
        local_59c0 = vandps_avx(auVar147,auVar169);
        auVar232 = ZEXT3264(local_59c0);
        local_5b80._0_8_ = *(undefined8 *)ray;
        local_5b80._8_8_ = *(undefined8 *)(ray + 8);
        local_5b80._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5b80._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5b80._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5b80._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5b80._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5b80._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5b80._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5b80._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5b80._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5b80._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5b20 = *(undefined1 (*) [32])(ray + 0x80);
        local_5b00 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5ae0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar227._8_4_ = 0x7fffffff;
        auVar227._0_8_ = 0x7fffffff7fffffff;
        auVar227._12_4_ = 0x7fffffff;
        auVar227._16_4_ = 0x7fffffff;
        auVar227._20_4_ = 0x7fffffff;
        auVar227._24_4_ = 0x7fffffff;
        auVar227._28_4_ = 0x7fffffff;
        auVar248._8_4_ = 0x219392ef;
        auVar248._0_8_ = 0x219392ef219392ef;
        auVar248._12_4_ = 0x219392ef;
        auVar248._16_4_ = 0x219392ef;
        auVar248._20_4_ = 0x219392ef;
        auVar248._24_4_ = 0x219392ef;
        auVar248._28_4_ = 0x219392ef;
        auVar222._8_4_ = 0x3f800000;
        auVar222._0_8_ = 0x3f8000003f800000;
        auVar222._12_4_ = 0x3f800000;
        auVar222._16_4_ = 0x3f800000;
        auVar222._20_4_ = 0x3f800000;
        auVar222._24_4_ = 0x3f800000;
        auVar222._28_4_ = 0x3f800000;
        auVar147 = vandps_avx(auVar227,local_5b20);
        auVar170 = vdivps_avx(auVar222,local_5b20);
        auVar129 = vcmpps_avx(auVar147,auVar248,1);
        auVar171 = vdivps_avx(auVar222,local_5b00);
        auVar147 = vandps_avx(auVar227,local_5b00);
        auVar188 = vdivps_avx(auVar222,local_5ae0);
        auVar225 = ZEXT3264(auVar188);
        auVar169 = vcmpps_avx(auVar147,auVar248,1);
        auVar147 = vandps_avx(auVar227,local_5ae0);
        auVar228._8_4_ = 0x5d5e0b6b;
        auVar228._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar228._12_4_ = 0x5d5e0b6b;
        auVar228._16_4_ = 0x5d5e0b6b;
        auVar228._20_4_ = 0x5d5e0b6b;
        auVar228._24_4_ = 0x5d5e0b6b;
        auVar228._28_4_ = 0x5d5e0b6b;
        _local_5ac0 = vblendvps_avx(auVar170,auVar228,auVar129);
        local_5aa0 = vblendvps_avx(auVar171,auVar228,auVar169);
        auVar147 = vcmpps_avx(auVar147,auVar248,1);
        local_5a80 = vblendvps_avx(auVar188,auVar228,auVar147);
        auVar129._8_4_ = 0x20;
        auVar129._0_8_ = 0x2000000020;
        auVar129._12_4_ = 0x20;
        auVar129._16_4_ = 0x20;
        auVar129._20_4_ = 0x20;
        auVar129._24_4_ = 0x20;
        auVar129._28_4_ = 0x20;
        auVar147 = vcmpps_avx(_local_5ac0,ZEXT1632(auVar145),1);
        local_5a60 = vandps_avx(auVar147,auVar129);
        auVar129 = ZEXT1632(auVar145);
        auVar147 = vcmpps_avx(local_5aa0,auVar129,5);
        auVar170._8_4_ = 0x40;
        auVar170._0_8_ = 0x4000000040;
        auVar170._12_4_ = 0x40;
        auVar170._16_4_ = 0x40;
        auVar170._20_4_ = 0x40;
        auVar170._24_4_ = 0x40;
        auVar170._28_4_ = 0x40;
        auVar199._8_4_ = 0x60;
        auVar199._0_8_ = 0x6000000060;
        auVar199._12_4_ = 0x60;
        auVar199._16_4_ = 0x60;
        auVar199._20_4_ = 0x60;
        auVar199._24_4_ = 0x60;
        auVar199._28_4_ = 0x60;
        auVar200 = ZEXT3264(auVar199);
        local_5a40 = vblendvps_avx(auVar199,auVar170,auVar147);
        auVar147 = vcmpps_avx(local_5a80,auVar129,5);
        auVar171._8_4_ = 0x80;
        auVar171._0_8_ = 0x8000000080;
        auVar171._12_4_ = 0x80;
        auVar171._16_4_ = 0x80;
        auVar171._20_4_ = 0x80;
        auVar171._24_4_ = 0x80;
        auVar171._28_4_ = 0x80;
        auVar188._8_4_ = 0xa0;
        auVar188._0_8_ = 0xa0000000a0;
        auVar188._12_4_ = 0xa0;
        auVar188._16_4_ = 0xa0;
        auVar188._20_4_ = 0xa0;
        auVar188._24_4_ = 0xa0;
        auVar188._28_4_ = 0xa0;
        local_5a20 = vblendvps_avx(auVar188,auVar171,auVar147);
        auVar147 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar129);
        auVar129 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar129);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar251 = ZEXT3264(local_4680);
        local_5a00 = vblendvps_avx(local_4680,auVar147,local_59c0);
        auVar147._8_4_ = 0xff800000;
        auVar147._0_8_ = 0xff800000ff800000;
        auVar147._12_4_ = 0xff800000;
        auVar147._16_4_ = 0xff800000;
        auVar147._20_4_ = 0xff800000;
        auVar147._24_4_ = 0xff800000;
        auVar147._28_4_ = 0xff800000;
        auVar156 = ZEXT3264(auVar147);
        local_59e0 = vblendvps_avx(auVar147,auVar129,local_59c0);
        auVar147 = vcmpps_avx(local_59e0,local_59e0,0xf);
        local_5f60._0_4_ = local_59c0._0_4_ ^ auVar147._0_4_;
        local_5f60._4_4_ = local_59c0._4_4_ ^ auVar147._4_4_;
        local_5f60._8_4_ = local_59c0._8_4_ ^ auVar147._8_4_;
        local_5f60._12_4_ = local_59c0._12_4_ ^ auVar147._12_4_;
        local_5f60._16_4_ = local_59c0._16_4_ ^ auVar147._16_4_;
        uStack_5f4c = local_59c0._20_4_ ^ auVar147._20_4_;
        uStack_5f48 = local_59c0._24_4_ ^ auVar147._24_4_;
        uStack_5f44 = local_59c0._28_4_ ^ auVar147._28_4_;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar108 = 7;
        }
        else {
          uVar108 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_6030 = ray + 0x100;
        puVar111 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar106 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5a00;
        local_5980 = mm_lookupmask_ps._16_8_;
        uStack_5978 = mm_lookupmask_ps._24_8_;
        uStack_5970 = mm_lookupmask_ps._16_8_;
        uStack_5968 = mm_lookupmask_ps._24_8_;
        local_5fa8 = (undefined1 (*) [32])&local_5e00;
        local_59a0 = mm_lookupmask_pd._0_8_;
        uStack_5998 = mm_lookupmask_pd._8_8_;
        uStack_5990 = mm_lookupmask_pd._0_8_;
        uStack_5988 = mm_lookupmask_pd._8_8_;
        auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        local_6070 = uVar108;
        local_5f38 = This;
LAB_0102c9ed:
        do {
          do {
            root.ptr = puVar111[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_0102e089;
            puVar111 = puVar111 + -1;
            pauVar106 = pauVar106 + -1;
            _local_6020 = *pauVar106;
            auVar264 = ZEXT3264(_local_6020);
            auVar147 = vcmpps_avx(_local_6020,local_59e0,1);
          } while ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar147 >> 0x7f,0) == '\0') &&
                     (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar147 >> 0xbf,0) == '\0') &&
                   (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar147[0x1f]);
          uVar110 = vmovmskps_avx(auVar147);
          unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar110);
          if (uVar108 < (uint)POPCOUNT(uVar110)) {
LAB_0102ca2a:
            do {
              iVar102 = 4;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_0102e089;
                auVar147 = vcmpps_avx(local_59e0,auVar264._0_32_,6);
                if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar147 >> 0x7f,0) == '\0') &&
                      (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar147 >> 0xbf,0) == '\0') &&
                    (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar147[0x1f]) goto LAB_0102c9ed;
                local_5f30 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar147 = vcmpps_avx(auVar147,auVar147,0xf);
                local_5f20._4_4_ = auVar147._4_4_ ^ local_5f60._4_4_;
                local_5f20._0_4_ = auVar147._0_4_ ^ local_5f60._0_4_;
                local_5f20._8_4_ = auVar147._8_4_ ^ local_5f60._8_4_;
                local_5f20._12_4_ = auVar147._12_4_ ^ local_5f60._12_4_;
                local_5f20._16_4_ = auVar147._16_4_ ^ local_5f60._16_4_;
                local_5f20._20_4_ = auVar147._20_4_ ^ uStack_5f4c;
                local_5f20._24_4_ = auVar147._24_4_ ^ uStack_5f48;
                local_5f20._28_4_ = auVar147._28_4_ ^ uStack_5f44;
                lVar103 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                unaff_R14 = 0;
                goto LAB_0102cc23;
              }
              uVar104 = 8;
              auVar147 = auVar251._0_32_;
              for (lVar103 = 0;
                  (auVar264 = ZEXT3264(auVar147), lVar103 != 8 &&
                  (uVar109 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar103 * 8), uVar109 != 8
                  )); lVar103 = lVar103 + 1) {
                uVar110 = *(undefined4 *)(root.ptr + 0x40 + lVar103 * 4);
                auVar112._4_4_ = uVar110;
                auVar112._0_4_ = uVar110;
                auVar112._8_4_ = uVar110;
                auVar112._12_4_ = uVar110;
                auVar112._16_4_ = uVar110;
                auVar112._20_4_ = uVar110;
                auVar112._24_4_ = uVar110;
                auVar112._28_4_ = uVar110;
                auVar90._8_8_ = local_5b80._8_8_;
                auVar90._0_8_ = local_5b80._0_8_;
                auVar90._16_8_ = local_5b80._16_8_;
                auVar90._24_8_ = local_5b80._24_8_;
                auVar91._8_8_ = local_5b80._40_8_;
                auVar91._0_8_ = local_5b80._32_8_;
                auVar91._16_8_ = local_5b80._48_8_;
                auVar91._24_8_ = local_5b80._56_8_;
                auVar92._8_8_ = local_5b80._72_8_;
                auVar92._0_8_ = local_5b80._64_8_;
                auVar92._16_8_ = local_5b80._80_8_;
                auVar92._24_8_ = local_5b80._88_8_;
                auVar129 = vsubps_avx(auVar112,auVar90);
                auVar264._0_4_ = (float)local_5ac0._0_4_ * auVar129._0_4_;
                auVar264._4_4_ = (float)local_5ac0._4_4_ * auVar129._4_4_;
                auVar264._8_4_ = fStack_5ab8 * auVar129._8_4_;
                auVar264._12_4_ = fStack_5ab4 * auVar129._12_4_;
                auVar264._16_4_ = fStack_5ab0 * auVar129._16_4_;
                auVar264._20_4_ = fStack_5aac * auVar129._20_4_;
                auVar264._28_36_ = auVar200._28_36_;
                auVar264._24_4_ = fStack_5aa8 * auVar129._24_4_;
                auVar170 = auVar264._0_32_;
                auVar200 = ZEXT3264(auVar170);
                uVar110 = *(undefined4 *)(root.ptr + 0x80 + lVar103 * 4);
                auVar113._4_4_ = uVar110;
                auVar113._0_4_ = uVar110;
                auVar113._8_4_ = uVar110;
                auVar113._12_4_ = uVar110;
                auVar113._16_4_ = uVar110;
                auVar113._20_4_ = uVar110;
                auVar113._24_4_ = uVar110;
                auVar113._28_4_ = uVar110;
                auVar129 = vsubps_avx(auVar113,auVar91);
                auVar226._0_4_ = local_5aa0._0_4_ * auVar129._0_4_;
                auVar226._4_4_ = local_5aa0._4_4_ * auVar129._4_4_;
                auVar226._8_4_ = local_5aa0._8_4_ * auVar129._8_4_;
                auVar226._12_4_ = local_5aa0._12_4_ * auVar129._12_4_;
                auVar226._16_4_ = local_5aa0._16_4_ * auVar129._16_4_;
                auVar226._20_4_ = local_5aa0._20_4_ * auVar129._20_4_;
                auVar226._28_36_ = auVar225._28_36_;
                auVar226._24_4_ = local_5aa0._24_4_ * auVar129._24_4_;
                auVar171 = auVar226._0_32_;
                auVar225 = ZEXT3264(auVar171);
                uVar110 = *(undefined4 *)(root.ptr + 0xc0 + lVar103 * 4);
                auVar114._4_4_ = uVar110;
                auVar114._0_4_ = uVar110;
                auVar114._8_4_ = uVar110;
                auVar114._12_4_ = uVar110;
                auVar114._16_4_ = uVar110;
                auVar114._20_4_ = uVar110;
                auVar114._24_4_ = uVar110;
                auVar114._28_4_ = uVar110;
                auVar129 = vsubps_avx(auVar114,auVar92);
                auVar233._0_4_ = local_5a80._0_4_ * auVar129._0_4_;
                auVar233._4_4_ = local_5a80._4_4_ * auVar129._4_4_;
                auVar233._8_4_ = local_5a80._8_4_ * auVar129._8_4_;
                auVar233._12_4_ = local_5a80._12_4_ * auVar129._12_4_;
                auVar233._16_4_ = local_5a80._16_4_ * auVar129._16_4_;
                auVar233._20_4_ = local_5a80._20_4_ * auVar129._20_4_;
                auVar233._28_36_ = auVar232._28_36_;
                auVar233._24_4_ = local_5a80._24_4_ * auVar129._24_4_;
                auVar188 = auVar233._0_32_;
                auVar232 = ZEXT3264(auVar188);
                uVar110 = *(undefined4 *)(root.ptr + 0x60 + lVar103 * 4);
                auVar115._4_4_ = uVar110;
                auVar115._0_4_ = uVar110;
                auVar115._8_4_ = uVar110;
                auVar115._12_4_ = uVar110;
                auVar115._16_4_ = uVar110;
                auVar115._20_4_ = uVar110;
                auVar115._24_4_ = uVar110;
                auVar115._28_4_ = uVar110;
                auVar129 = vsubps_avx(auVar115,auVar90);
                auVar17._4_4_ = (float)local_5ac0._4_4_ * auVar129._4_4_;
                auVar17._0_4_ = (float)local_5ac0._0_4_ * auVar129._0_4_;
                auVar17._8_4_ = fStack_5ab8 * auVar129._8_4_;
                auVar17._12_4_ = fStack_5ab4 * auVar129._12_4_;
                auVar17._16_4_ = fStack_5ab0 * auVar129._16_4_;
                auVar17._20_4_ = fStack_5aac * auVar129._20_4_;
                auVar17._24_4_ = fStack_5aa8 * auVar129._24_4_;
                auVar17._28_4_ = (int)((ulong)local_5b80._24_8_ >> 0x20);
                uVar110 = *(undefined4 *)(root.ptr + 0xa0 + lVar103 * 4);
                auVar116._4_4_ = uVar110;
                auVar116._0_4_ = uVar110;
                auVar116._8_4_ = uVar110;
                auVar116._12_4_ = uVar110;
                auVar116._16_4_ = uVar110;
                auVar116._20_4_ = uVar110;
                auVar116._24_4_ = uVar110;
                auVar116._28_4_ = uVar110;
                auVar129 = vsubps_avx(auVar116,auVar91);
                auVar18._4_4_ = local_5aa0._4_4_ * auVar129._4_4_;
                auVar18._0_4_ = local_5aa0._0_4_ * auVar129._0_4_;
                auVar18._8_4_ = local_5aa0._8_4_ * auVar129._8_4_;
                auVar18._12_4_ = local_5aa0._12_4_ * auVar129._12_4_;
                auVar18._16_4_ = local_5aa0._16_4_ * auVar129._16_4_;
                auVar18._20_4_ = local_5aa0._20_4_ * auVar129._20_4_;
                auVar18._24_4_ = local_5aa0._24_4_ * auVar129._24_4_;
                auVar18._28_4_ = (int)((ulong)local_5b80._56_8_ >> 0x20);
                uVar110 = *(undefined4 *)(root.ptr + 0xe0 + lVar103 * 4);
                auVar117._4_4_ = uVar110;
                auVar117._0_4_ = uVar110;
                auVar117._8_4_ = uVar110;
                auVar117._12_4_ = uVar110;
                auVar117._16_4_ = uVar110;
                auVar117._20_4_ = uVar110;
                auVar117._24_4_ = uVar110;
                auVar117._28_4_ = uVar110;
                auVar129 = vsubps_avx(auVar117,auVar92);
                auVar19._4_4_ = local_5a80._4_4_ * auVar129._4_4_;
                auVar19._0_4_ = local_5a80._0_4_ * auVar129._0_4_;
                auVar19._8_4_ = local_5a80._8_4_ * auVar129._8_4_;
                auVar19._12_4_ = local_5a80._12_4_ * auVar129._12_4_;
                auVar19._16_4_ = local_5a80._16_4_ * auVar129._16_4_;
                auVar19._20_4_ = local_5a80._20_4_ * auVar129._20_4_;
                auVar19._24_4_ = local_5a80._24_4_ * auVar129._24_4_;
                auVar19._28_4_ = (int)((ulong)local_5b80._88_8_ >> 0x20);
                auVar129 = vminps_avx(auVar170,auVar17);
                auVar169 = vminps_avx(auVar171,auVar18);
                auVar129 = vmaxps_avx(auVar129,auVar169);
                auVar169 = vminps_avx(auVar188,auVar19);
                auVar129 = vmaxps_avx(auVar129,auVar169);
                auVar20._4_4_ = auVar254._4_4_ * auVar129._4_4_;
                auVar20._0_4_ = auVar254._0_4_ * auVar129._0_4_;
                auVar20._8_4_ = auVar254._8_4_ * auVar129._8_4_;
                auVar20._12_4_ = auVar254._12_4_ * auVar129._12_4_;
                auVar20._16_4_ = auVar254._16_4_ * auVar129._16_4_;
                auVar20._20_4_ = auVar254._20_4_ * auVar129._20_4_;
                auVar20._24_4_ = auVar254._24_4_ * auVar129._24_4_;
                auVar20._28_4_ = auVar129._28_4_;
                auVar129 = vmaxps_avx(auVar170,auVar17);
                auVar169 = vmaxps_avx(auVar171,auVar18);
                auVar169 = vminps_avx(auVar129,auVar169);
                auVar129 = vmaxps_avx(auVar188,auVar19);
                auVar129 = vminps_avx(auVar169,auVar129);
                auVar21._4_4_ = auVar256._4_4_ * auVar129._4_4_;
                auVar21._0_4_ = auVar256._0_4_ * auVar129._0_4_;
                auVar21._8_4_ = auVar256._8_4_ * auVar129._8_4_;
                auVar21._12_4_ = auVar256._12_4_ * auVar129._12_4_;
                auVar21._16_4_ = auVar256._16_4_ * auVar129._16_4_;
                auVar21._20_4_ = auVar256._20_4_ * auVar129._20_4_;
                auVar21._24_4_ = auVar256._24_4_ * auVar129._24_4_;
                auVar21._28_4_ = auVar129._28_4_;
                auVar129 = vmaxps_avx(auVar20,local_5a00);
                auVar156 = ZEXT3264(auVar129);
                auVar169 = vminps_avx(auVar21,local_59e0);
                auVar169 = vcmpps_avx(auVar129,auVar169,2);
                uVar107 = uVar104;
                auVar129 = auVar147;
                if (((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar169 >> 0x7f,0) != '\0') ||
                       (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar169 >> 0xbf,0) != '\0') ||
                     (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar169[0x1f] < '\0') &&
                   (auVar129 = vblendvps_avx(auVar251._0_32_,auVar20,auVar169), uVar107 = uVar109,
                   uVar104 != 8)) {
                  *puVar111 = uVar104;
                  puVar111 = puVar111 + 1;
                  *pauVar106 = auVar147;
                  pauVar106 = pauVar106 + 1;
                }
                auVar147 = auVar129;
                uVar104 = uVar107;
              }
              if (uVar104 == 8) goto LAB_0102cbb5;
              auVar129 = vcmpps_avx(local_59e0,auVar147,6);
              uVar110 = vmovmskps_avx(auVar129);
              root.ptr = uVar104;
            } while ((byte)uVar108 < (byte)POPCOUNT(uVar110));
            *puVar111 = uVar104;
            puVar111 = puVar111 + 1;
            *pauVar106 = auVar147;
            pauVar106 = pauVar106 + 1;
          }
          else {
            while (auVar146 = auVar156._0_16_, unaff_R14 != 0) {
              k = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> k & 1) == 0; k = k + 1) {
                }
              }
              unaff_R14 = unaff_R14 & unaff_R14 - 1;
              local_6000._0_8_ = k;
              auVar156 = ZEXT1664(auVar146);
              auVar200 = ZEXT1664(auVar200._0_16_);
              auVar225 = ZEXT1664(auVar225._0_16_);
              auVar232 = ZEXT1664(auVar232._0_16_);
              bVar101 = occluded1(local_5f38,local_5f40,root,k,&local_6071,ray,
                                  (TravRayK<8,_true> *)&local_5b80.field_0,context);
              uVar108 = local_6070;
              if (bVar101) {
                *(undefined4 *)(local_5f60 + local_6000._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar146 = vpcmpeqd_avx(auVar146,auVar146);
            auVar144 = vpcmpgtd_avx(stack0xffffffffffffa0b0,auVar146);
            auVar146 = vpcmpgtd_avx(local_5f60._0_16_,auVar146);
            auVar156 = ZEXT1664(auVar146);
            auVar146 = vpor_avx(auVar146,auVar144);
            iVar102 = 3;
            auVar251 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar264 = ZEXT3264(_local_6020);
            if ((((auVar146 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar146 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar146 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar146[0xf] < '\0') {
              auVar155._8_4_ = 0xff800000;
              auVar155._0_8_ = 0xff800000ff800000;
              auVar155._12_4_ = 0xff800000;
              auVar155._16_4_ = 0xff800000;
              auVar155._20_4_ = 0xff800000;
              auVar155._24_4_ = 0xff800000;
              auVar155._28_4_ = 0xff800000;
              auVar156 = ZEXT3264(auVar155);
              local_59e0 = vblendvps_avx(local_59e0,auVar155,_local_5f60);
              iVar102 = 2;
            }
            unaff_R14 = 0;
            if ((uint)uVar108 < (uint)POPCOUNT(uVar110)) goto LAB_0102ca2a;
          }
LAB_0102cbb5:
        } while (iVar102 != 3);
LAB_0102e089:
        auVar147 = vandps_avx(local_59c0,_local_5f60);
        auVar142._8_4_ = 0xff800000;
        auVar142._0_8_ = 0xff800000ff800000;
        auVar142._12_4_ = 0xff800000;
        auVar142._16_4_ = 0xff800000;
        auVar142._20_4_ = 0xff800000;
        auVar142._24_4_ = 0xff800000;
        auVar142._28_4_ = 0xff800000;
        auVar147 = vmaskmovps_avx(auVar147,auVar142);
        *(undefined1 (*) [32])local_6030 = auVar147;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_0102cc23:
  do {
    lVar105 = -0x10;
    auVar146 = auVar156._0_16_;
    if (unaff_R14 == local_5f30) break;
    local_5f28 = context->scene;
    auVar232 = ZEXT3264(local_5f20);
    local_6068 = unaff_R14;
    while( true ) {
      auVar147 = auVar232._0_32_;
      if ((lVar105 == 0) || (uVar5 = *(uint *)(lVar103 + 0x10 + lVar105), uVar5 == 0xffffffff))
      goto LAB_0102def1;
      uVar109 = CONCAT44(0,*(uint *)(lVar103 + lVar105));
      local_5f00._0_8_ = uVar109;
      pfVar7 = (local_5f28->vertices).items[uVar109];
      uVar104 = (ulong)*(uint *)(lVar103 + -0x40 + lVar105);
      fVar247 = pfVar7[uVar104];
      auVar272._4_4_ = fVar247;
      auVar272._0_4_ = fVar247;
      auVar272._8_4_ = fVar247;
      auVar272._12_4_ = fVar247;
      auVar272._16_4_ = fVar247;
      auVar272._20_4_ = fVar247;
      auVar272._24_4_ = fVar247;
      auVar272._28_4_ = fVar247;
      fVar247 = pfVar7[uVar104 + 1];
      auVar130._4_4_ = fVar247;
      auVar130._0_4_ = fVar247;
      auVar130._8_4_ = fVar247;
      auVar130._12_4_ = fVar247;
      auVar130._16_4_ = fVar247;
      auVar130._20_4_ = fVar247;
      auVar130._24_4_ = fVar247;
      auVar130._28_4_ = fVar247;
      fVar247 = pfVar7[uVar104 + 2];
      auVar148._4_4_ = fVar247;
      auVar148._0_4_ = fVar247;
      auVar148._8_4_ = fVar247;
      auVar148._12_4_ = fVar247;
      auVar148._16_4_ = fVar247;
      auVar148._20_4_ = fVar247;
      auVar148._24_4_ = fVar247;
      auVar148._28_4_ = fVar247;
      uVar104 = (ulong)*(uint *)(lVar103 + -0x10 + lVar105);
      fVar247 = pfVar7[uVar104];
      local_5d80._4_4_ = fVar247;
      local_5d80._0_4_ = fVar247;
      local_5d80._8_4_ = fVar247;
      local_5d80._12_4_ = fVar247;
      local_5d80._16_4_ = fVar247;
      local_5d80._20_4_ = fVar247;
      local_5d80._24_4_ = fVar247;
      local_5d80._28_4_ = fVar247;
      fVar247 = pfVar7[uVar104 + 1];
      local_5da0._4_4_ = fVar247;
      local_5da0._0_4_ = fVar247;
      local_5da0._8_4_ = fVar247;
      local_5da0._12_4_ = fVar247;
      local_5da0._16_4_ = fVar247;
      local_5da0._20_4_ = fVar247;
      local_5da0._24_4_ = fVar247;
      local_5da0._28_4_ = fVar247;
      fVar4 = pfVar7[uVar104 + 2];
      local_5dc0._4_4_ = fVar4;
      local_5dc0._0_4_ = fVar4;
      local_5dc0._8_4_ = fVar4;
      local_5dc0._12_4_ = fVar4;
      local_5dc0._16_4_ = fVar4;
      local_5dc0._20_4_ = fVar4;
      local_5dc0._24_4_ = fVar4;
      local_5dc0._28_4_ = fVar4;
      auVar129 = *(undefined1 (*) [32])(ray + 0x20);
      auVar169 = *(undefined1 (*) [32])(ray + 0x40);
      local_5c60 = vsubps_avx(auVar130,auVar129);
      local_5c80 = vsubps_avx(auVar148,auVar169);
      auVar171 = vsubps_avx(local_5da0,auVar129);
      auVar188 = vsubps_avx(local_5dc0,auVar169);
      local_5cc0 = vsubps_avx(auVar171,local_5c60);
      local_5ce0 = vsubps_avx(auVar188,local_5c80);
      fVar212 = local_5c60._0_4_;
      fVar213 = fVar212 + auVar171._0_4_;
      fVar231 = local_5c60._4_4_;
      fVar216 = fVar231 + auVar171._4_4_;
      fVar235 = local_5c60._8_4_;
      fVar217 = fVar235 + auVar171._8_4_;
      fVar237 = local_5c60._12_4_;
      fVar218 = fVar237 + auVar171._12_4_;
      fVar239 = local_5c60._16_4_;
      fVar219 = fVar239 + auVar171._16_4_;
      fVar241 = local_5c60._20_4_;
      fVar220 = fVar241 + auVar171._20_4_;
      fVar243 = local_5c60._24_4_;
      fVar221 = fVar243 + auVar171._24_4_;
      fVar197 = auVar171._28_4_;
      fVar4 = local_5c80._0_4_;
      fVar230 = auVar188._0_4_ + fVar4;
      fVar11 = local_5c80._4_4_;
      fVar234 = auVar188._4_4_ + fVar11;
      fVar12 = local_5c80._8_4_;
      fVar236 = auVar188._8_4_ + fVar12;
      fVar13 = local_5c80._12_4_;
      fVar238 = auVar188._12_4_ + fVar13;
      fVar14 = local_5c80._16_4_;
      fVar240 = auVar188._16_4_ + fVar14;
      fVar15 = local_5c80._20_4_;
      fVar242 = auVar188._20_4_ + fVar15;
      fVar126 = local_5c80._24_4_;
      fVar244 = auVar188._24_4_ + fVar126;
      fVar246 = auVar188._28_4_ + local_5c80._28_4_;
      fVar245 = local_5ce0._0_4_;
      fVar255 = local_5ce0._4_4_;
      auVar22._4_4_ = fVar255 * fVar216;
      auVar22._0_4_ = fVar245 * fVar213;
      fVar257 = local_5ce0._8_4_;
      auVar22._8_4_ = fVar257 * fVar217;
      fVar258 = local_5ce0._12_4_;
      auVar22._12_4_ = fVar258 * fVar218;
      fVar259 = local_5ce0._16_4_;
      auVar22._16_4_ = fVar259 * fVar219;
      fVar260 = local_5ce0._20_4_;
      auVar22._20_4_ = fVar260 * fVar220;
      fVar261 = local_5ce0._24_4_;
      auVar22._24_4_ = fVar261 * fVar221;
      auVar22._28_4_ = fVar247;
      fVar121 = local_5cc0._0_4_;
      auVar232._0_4_ = fVar230 * fVar121;
      fVar122 = local_5cc0._4_4_;
      auVar232._4_4_ = fVar234 * fVar122;
      fVar123 = local_5cc0._8_4_;
      auVar232._8_4_ = fVar236 * fVar123;
      fVar124 = local_5cc0._12_4_;
      auVar232._12_4_ = fVar238 * fVar124;
      fVar125 = local_5cc0._16_4_;
      auVar232._16_4_ = fVar240 * fVar125;
      fVar127 = local_5cc0._20_4_;
      auVar232._20_4_ = fVar242 * fVar127;
      fVar128 = local_5cc0._24_4_;
      auVar232._28_36_ = auVar251._28_36_;
      auVar232._24_4_ = fVar244 * fVar128;
      auVar199 = vsubps_avx(auVar232._0_32_,auVar22);
      auVar170 = *(undefined1 (*) [32])ray;
      local_5ca0 = vsubps_avx(auVar272,auVar170);
      auVar222 = vsubps_avx(local_5d80,auVar170);
      _local_5d00 = vsubps_avx(auVar222,local_5ca0);
      fVar178 = local_5d00._0_4_;
      fVar180 = local_5d00._4_4_;
      auVar23._4_4_ = fVar180 * fVar234;
      auVar23._0_4_ = fVar178 * fVar230;
      fVar182 = local_5d00._8_4_;
      auVar23._8_4_ = fVar182 * fVar236;
      fVar184 = local_5d00._12_4_;
      auVar23._12_4_ = fVar184 * fVar238;
      fVar186 = local_5d00._16_4_;
      auVar23._16_4_ = fVar186 * fVar240;
      fVar187 = local_5d00._20_4_;
      auVar23._20_4_ = fVar187 * fVar242;
      fVar194 = local_5d00._24_4_;
      auVar23._24_4_ = fVar194 * fVar244;
      auVar23._28_4_ = fVar246;
      fVar262 = local_5ca0._0_4_;
      fVar247 = fVar262 + auVar222._0_4_;
      fVar265 = local_5ca0._4_4_;
      fVar230 = fVar265 + auVar222._4_4_;
      fVar267 = local_5ca0._8_4_;
      fVar234 = fVar267 + auVar222._8_4_;
      fVar269 = local_5ca0._12_4_;
      fVar236 = fVar269 + auVar222._12_4_;
      fVar271 = local_5ca0._16_4_;
      fVar238 = fVar271 + auVar222._16_4_;
      fVar274 = local_5ca0._20_4_;
      fVar240 = fVar274 + auVar222._20_4_;
      fVar276 = local_5ca0._24_4_;
      fVar242 = fVar276 + auVar222._24_4_;
      auVar24._4_4_ = fVar230 * fVar255;
      auVar24._0_4_ = fVar247 * fVar245;
      auVar24._8_4_ = fVar234 * fVar257;
      auVar24._12_4_ = fVar236 * fVar258;
      auVar24._16_4_ = fVar238 * fVar259;
      auVar24._20_4_ = fVar240 * fVar260;
      auVar24._24_4_ = fVar242 * fVar261;
      auVar24._28_4_ = local_5ce0._28_4_;
      auVar227 = vsubps_avx(auVar24,auVar23);
      auVar25._4_4_ = fVar230 * fVar122;
      auVar25._0_4_ = fVar247 * fVar121;
      auVar25._8_4_ = fVar234 * fVar123;
      auVar25._12_4_ = fVar236 * fVar124;
      auVar25._16_4_ = fVar238 * fVar125;
      auVar25._20_4_ = fVar240 * fVar127;
      auVar25._24_4_ = fVar242 * fVar128;
      auVar25._28_4_ = fVar246;
      auVar26._4_4_ = fVar180 * fVar216;
      auVar26._0_4_ = fVar178 * fVar213;
      auVar26._8_4_ = fVar182 * fVar217;
      auVar26._12_4_ = fVar184 * fVar218;
      auVar26._16_4_ = fVar186 * fVar219;
      auVar26._20_4_ = fVar187 * fVar220;
      auVar26._24_4_ = fVar194 * fVar221;
      auVar26._28_4_ = local_5c60._28_4_ + fVar197;
      auVar228 = vsubps_avx(auVar26,auVar25);
      auVar98 = *(undefined1 (*) [28])(ray + 0xc0);
      pRVar1 = ray + 0xa0;
      auVar99 = *(undefined1 (*) [28])pRVar1;
      auVar248 = *(undefined1 (*) [32])pRVar1;
      uVar104 = (ulong)*(uint *)(lVar103 + -0x30 + lVar105);
      pRVar2 = ray + 0x80;
      fVar213 = *(float *)pRVar2;
      fVar216 = *(float *)(ray + 0x84);
      fVar217 = *(float *)(ray + 0x88);
      fVar218 = *(float *)(ray + 0x8c);
      fVar219 = *(float *)(ray + 0x90);
      fVar220 = *(float *)(ray + 0x94);
      fVar221 = *(float *)(ray + 0x98);
      auVar100 = *(undefined1 (*) [28])pRVar2;
      _local_5d20 = *(undefined1 (*) [32])pRVar2;
      fVar247 = pfVar7[uVar104 + 1];
      local_5840._4_4_ = fVar247;
      local_5840._0_4_ = fVar247;
      local_5840._8_4_ = fVar247;
      local_5840._12_4_ = fVar247;
      local_5840._16_4_ = fVar247;
      local_5840._20_4_ = fVar247;
      local_5840._24_4_ = fVar247;
      local_5840._28_4_ = fVar247;
      local_5900._0_4_ =
           fVar213 * auVar199._0_4_ +
           auVar227._0_4_ * *(float *)pRVar1 + auVar228._0_4_ * *(float *)(ray + 0xc0);
      local_5900._4_4_ =
           fVar216 * auVar199._4_4_ +
           auVar227._4_4_ * *(float *)(ray + 0xa4) + auVar228._4_4_ * *(float *)(ray + 0xc4);
      local_5900._8_4_ =
           fVar217 * auVar199._8_4_ +
           auVar227._8_4_ * *(float *)(ray + 0xa8) + auVar228._8_4_ * *(float *)(ray + 200);
      local_5900._12_4_ =
           fVar218 * auVar199._12_4_ +
           auVar227._12_4_ * *(float *)(ray + 0xac) + auVar228._12_4_ * *(float *)(ray + 0xcc);
      local_5900._16_4_ =
           fVar219 * auVar199._16_4_ +
           auVar227._16_4_ * *(float *)(ray + 0xb0) + auVar228._16_4_ * *(float *)(ray + 0xd0);
      local_5900._20_4_ =
           fVar220 * auVar199._20_4_ +
           auVar227._20_4_ * *(float *)(ray + 0xb4) + auVar228._20_4_ * *(float *)(ray + 0xd4);
      local_5900._24_4_ =
           fVar221 * auVar199._24_4_ +
           auVar227._24_4_ * *(float *)(ray + 0xb8) + auVar228._24_4_ * *(float *)(ray + 0xd8);
      local_5900._28_4_ = *(float *)(ray + 0xbc) + auVar227._28_4_ + auVar228._28_4_;
      auVar129 = vsubps_avx(local_5840,auVar129);
      fVar247 = pfVar7[uVar104 + 2];
      local_5860._4_4_ = fVar247;
      local_5860._0_4_ = fVar247;
      local_5860._8_4_ = fVar247;
      local_5860._12_4_ = fVar247;
      local_5860._16_4_ = fVar247;
      local_5860._20_4_ = fVar247;
      local_5860._24_4_ = fVar247;
      local_5860._28_4_ = fVar247;
      auVar169 = vsubps_avx(local_5860,auVar169);
      local_5d40 = vsubps_avx(local_5c60,auVar129);
      local_5d60 = vsubps_avx(local_5c80,auVar169);
      fVar230 = fVar212 + auVar129._0_4_;
      fVar234 = fVar231 + auVar129._4_4_;
      fVar236 = fVar235 + auVar129._8_4_;
      fVar238 = fVar237 + auVar129._12_4_;
      fVar240 = fVar239 + auVar129._16_4_;
      fVar242 = fVar241 + auVar129._20_4_;
      fVar244 = fVar243 + auVar129._24_4_;
      fVar166 = fVar4 + auVar169._0_4_;
      fVar175 = fVar11 + auVar169._4_4_;
      fVar177 = fVar12 + auVar169._8_4_;
      fVar179 = fVar13 + auVar169._12_4_;
      fVar181 = fVar14 + auVar169._16_4_;
      fVar183 = fVar15 + auVar169._20_4_;
      fVar185 = fVar126 + auVar169._24_4_;
      fVar195 = local_5d60._0_4_;
      fVar198 = local_5d60._4_4_;
      auVar27._4_4_ = fVar198 * fVar234;
      auVar27._0_4_ = fVar195 * fVar230;
      fVar202 = local_5d60._8_4_;
      auVar27._8_4_ = fVar202 * fVar236;
      fVar204 = local_5d60._12_4_;
      auVar27._12_4_ = fVar204 * fVar238;
      fVar206 = local_5d60._16_4_;
      auVar27._16_4_ = fVar206 * fVar240;
      fVar208 = local_5d60._20_4_;
      auVar27._20_4_ = fVar208 * fVar242;
      fVar210 = local_5d60._24_4_;
      auVar27._24_4_ = fVar210 * fVar244;
      auVar27._28_4_ = local_5d00._28_4_;
      fVar252 = local_5d40._0_4_;
      fVar159 = local_5d40._4_4_;
      auVar28._4_4_ = fVar159 * fVar175;
      auVar28._0_4_ = fVar252 * fVar166;
      fVar161 = local_5d40._8_4_;
      auVar28._8_4_ = fVar161 * fVar177;
      fVar163 = local_5d40._12_4_;
      auVar28._12_4_ = fVar163 * fVar179;
      fVar165 = local_5d40._16_4_;
      auVar28._16_4_ = fVar165 * fVar181;
      fVar168 = local_5d40._20_4_;
      auVar28._20_4_ = fVar168 * fVar183;
      fVar176 = local_5d40._24_4_;
      auVar28._24_4_ = fVar176 * fVar185;
      auVar28._28_4_ = fVar246;
      auVar199 = vsubps_avx(auVar28,auVar27);
      fVar247 = pfVar7[uVar104];
      local_5880._4_4_ = fVar247;
      local_5880._0_4_ = fVar247;
      local_5880._8_4_ = fVar247;
      local_5880._12_4_ = fVar247;
      local_5880._16_4_ = fVar247;
      local_5880._20_4_ = fVar247;
      local_5880._24_4_ = fVar247;
      local_5880._28_4_ = fVar247;
      auVar170 = vsubps_avx(local_5880,auVar170);
      auVar227 = vsubps_avx(local_5ca0,auVar170);
      fVar278 = auVar227._0_4_;
      fVar279 = auVar227._4_4_;
      auVar29._4_4_ = fVar279 * fVar175;
      auVar29._0_4_ = fVar278 * fVar166;
      fVar280 = auVar227._8_4_;
      auVar29._8_4_ = fVar280 * fVar177;
      fVar281 = auVar227._12_4_;
      auVar29._12_4_ = fVar281 * fVar179;
      fVar282 = auVar227._16_4_;
      auVar29._16_4_ = fVar282 * fVar181;
      fVar283 = auVar227._20_4_;
      auVar29._20_4_ = fVar283 * fVar183;
      fVar284 = auVar227._24_4_;
      auVar29._24_4_ = fVar284 * fVar185;
      auVar29._28_4_ = local_5c80._28_4_ + auVar169._28_4_;
      fVar247 = fVar262 + auVar170._0_4_;
      fVar166 = fVar265 + auVar170._4_4_;
      fVar175 = fVar267 + auVar170._8_4_;
      fVar177 = fVar269 + auVar170._12_4_;
      fVar179 = fVar271 + auVar170._16_4_;
      fVar181 = fVar274 + auVar170._20_4_;
      fVar183 = fVar276 + auVar170._24_4_;
      auVar30._4_4_ = fVar166 * fVar198;
      auVar30._0_4_ = fVar247 * fVar195;
      auVar30._8_4_ = fVar175 * fVar202;
      auVar30._12_4_ = fVar177 * fVar204;
      auVar30._16_4_ = fVar179 * fVar206;
      auVar30._20_4_ = fVar181 * fVar208;
      uVar110 = local_5d60._28_4_;
      auVar30._24_4_ = fVar183 * fVar210;
      auVar30._28_4_ = uVar110;
      auVar227 = vsubps_avx(auVar30,auVar29);
      auVar31._4_4_ = fVar166 * fVar159;
      auVar31._0_4_ = fVar247 * fVar252;
      auVar31._8_4_ = fVar175 * fVar161;
      auVar31._12_4_ = fVar177 * fVar163;
      auVar31._16_4_ = fVar179 * fVar165;
      auVar31._20_4_ = fVar181 * fVar168;
      auVar31._24_4_ = fVar183 * fVar176;
      auVar31._28_4_ = uVar110;
      auVar32._4_4_ = fVar279 * fVar234;
      auVar32._0_4_ = fVar278 * fVar230;
      auVar32._8_4_ = fVar280 * fVar236;
      auVar32._12_4_ = fVar281 * fVar238;
      auVar32._16_4_ = fVar282 * fVar240;
      auVar32._20_4_ = fVar283 * fVar242;
      auVar32._24_4_ = fVar284 * fVar244;
      auVar32._28_4_ = local_5c60._28_4_ + auVar129._28_4_;
      auVar228 = vsubps_avx(auVar32,auVar31);
      local_6020 = auVar98._0_4_;
      auStack_601c._0_4_ = auVar98._4_4_;
      auStack_601c._4_4_ = auVar98._8_4_;
      fStack_6014 = auVar98._12_4_;
      fStack_6010 = auVar98._16_4_;
      fStack_600c = auVar98._20_4_;
      fStack_6008 = auVar98._24_4_;
      local_5f80._0_4_ = auVar99._0_4_;
      local_5f80._4_4_ = auVar99._4_4_;
      fStack_5f78 = auVar99._8_4_;
      fStack_5f74 = auVar99._12_4_;
      fStack_5f70 = auVar99._16_4_;
      fStack_5f6c = auVar99._20_4_;
      fStack_5f68 = auVar99._24_4_;
      auVar189._0_4_ =
           fVar213 * auVar199._0_4_ +
           (float)local_6020 * auVar228._0_4_ + (float)local_5f80._0_4_ * auVar227._0_4_;
      auVar189._4_4_ =
           fVar216 * auVar199._4_4_ +
           (float)auStack_601c._0_4_ * auVar228._4_4_ + (float)local_5f80._4_4_ * auVar227._4_4_;
      auVar189._8_4_ =
           fVar217 * auVar199._8_4_ +
           (float)auStack_601c._4_4_ * auVar228._8_4_ + fStack_5f78 * auVar227._8_4_;
      auVar189._12_4_ =
           fVar218 * auVar199._12_4_ + fStack_6014 * auVar228._12_4_ + fStack_5f74 * auVar227._12_4_
      ;
      auVar189._16_4_ =
           fVar219 * auVar199._16_4_ + fStack_6010 * auVar228._16_4_ + fStack_5f70 * auVar227._16_4_
      ;
      auVar189._20_4_ =
           fVar220 * auVar199._20_4_ + fStack_600c * auVar228._20_4_ + fStack_5f6c * auVar227._20_4_
      ;
      auVar189._24_4_ =
           fVar221 * auVar199._24_4_ + fStack_6008 * auVar228._24_4_ + fStack_5f68 * auVar227._24_4_
      ;
      auVar189._28_4_ = auVar227._28_4_ + auVar228._28_4_ + auVar227._28_4_;
      auVar227 = vsubps_avx(auVar170,auVar222);
      fVar196 = auVar170._0_4_ + auVar222._0_4_;
      fVar201 = auVar170._4_4_ + auVar222._4_4_;
      fVar203 = auVar170._8_4_ + auVar222._8_4_;
      fVar205 = auVar170._12_4_ + auVar222._12_4_;
      fVar207 = auVar170._16_4_ + auVar222._16_4_;
      fVar209 = auVar170._20_4_ + auVar222._20_4_;
      fVar211 = auVar170._24_4_ + auVar222._24_4_;
      auVar232 = ZEXT3264(auVar147);
      auVar228 = vsubps_avx(auVar129,auVar171);
      fVar244 = auVar129._0_4_ + auVar171._0_4_;
      fVar166 = auVar129._4_4_ + auVar171._4_4_;
      fVar175 = auVar129._8_4_ + auVar171._8_4_;
      fVar177 = auVar129._12_4_ + auVar171._12_4_;
      fVar179 = auVar129._16_4_ + auVar171._16_4_;
      fVar181 = auVar129._20_4_ + auVar171._20_4_;
      fVar183 = auVar129._24_4_ + auVar171._24_4_;
      auVar171 = vsubps_avx(auVar169,auVar188);
      fVar185 = auVar169._0_4_ + auVar188._0_4_;
      fVar246 = auVar169._4_4_ + auVar188._4_4_;
      fVar157 = auVar169._8_4_ + auVar188._8_4_;
      fVar158 = auVar169._12_4_ + auVar188._12_4_;
      fVar160 = auVar169._16_4_ + auVar188._16_4_;
      fVar162 = auVar169._20_4_ + auVar188._20_4_;
      fVar164 = auVar169._24_4_ + auVar188._24_4_;
      fVar263 = auVar171._0_4_;
      fVar266 = auVar171._4_4_;
      auVar33._4_4_ = fVar266 * fVar166;
      auVar33._0_4_ = fVar263 * fVar244;
      fVar268 = auVar171._8_4_;
      auVar33._8_4_ = fVar268 * fVar175;
      fVar270 = auVar171._12_4_;
      auVar33._12_4_ = fVar270 * fVar177;
      fVar273 = auVar171._16_4_;
      auVar33._16_4_ = fVar273 * fVar179;
      fVar275 = auVar171._20_4_;
      auVar33._20_4_ = fVar275 * fVar181;
      fVar277 = auVar171._24_4_;
      auVar33._24_4_ = fVar277 * fVar183;
      auVar33._28_4_ = fVar197;
      fVar247 = auVar228._0_4_;
      fVar230 = auVar228._4_4_;
      auVar34._4_4_ = fVar230 * fVar246;
      auVar34._0_4_ = fVar247 * fVar185;
      fVar234 = auVar228._8_4_;
      auVar34._8_4_ = fVar234 * fVar157;
      fVar236 = auVar228._12_4_;
      auVar34._12_4_ = fVar236 * fVar158;
      fVar238 = auVar228._16_4_;
      auVar34._16_4_ = fVar238 * fVar160;
      fVar240 = auVar228._20_4_;
      auVar34._20_4_ = fVar240 * fVar162;
      fVar242 = auVar228._24_4_;
      auVar34._24_4_ = fVar242 * fVar164;
      auVar34._28_4_ = auVar199._28_4_;
      auVar171 = vsubps_avx(auVar34,auVar33);
      fVar167 = auVar227._0_4_;
      fVar143 = auVar227._4_4_;
      auVar35._4_4_ = fVar143 * fVar246;
      auVar35._0_4_ = fVar167 * fVar185;
      fVar185 = auVar227._8_4_;
      auVar35._8_4_ = fVar185 * fVar157;
      fVar246 = auVar227._12_4_;
      auVar35._12_4_ = fVar246 * fVar158;
      fVar157 = auVar227._16_4_;
      auVar35._16_4_ = fVar157 * fVar160;
      fVar158 = auVar227._20_4_;
      auVar35._20_4_ = fVar158 * fVar162;
      fVar160 = auVar227._24_4_;
      auVar35._24_4_ = fVar160 * fVar164;
      auVar35._28_4_ = auVar169._28_4_ + auVar188._28_4_;
      auVar36._4_4_ = fVar266 * fVar201;
      auVar36._0_4_ = fVar263 * fVar196;
      auVar36._8_4_ = fVar268 * fVar203;
      auVar36._12_4_ = fVar270 * fVar205;
      auVar36._16_4_ = fVar273 * fVar207;
      auVar36._20_4_ = fVar275 * fVar209;
      auVar36._24_4_ = fVar277 * fVar211;
      auVar36._28_4_ = auVar199._28_4_;
      auVar169 = vsubps_avx(auVar36,auVar35);
      auVar37._4_4_ = fVar201 * fVar230;
      auVar37._0_4_ = fVar196 * fVar247;
      auVar37._8_4_ = fVar203 * fVar234;
      auVar37._12_4_ = fVar205 * fVar236;
      auVar37._16_4_ = fVar207 * fVar238;
      auVar37._20_4_ = fVar209 * fVar240;
      auVar37._24_4_ = fVar211 * fVar242;
      auVar37._28_4_ = auVar170._28_4_ + auVar222._28_4_;
      auVar38._4_4_ = fVar143 * fVar166;
      auVar38._0_4_ = fVar167 * fVar244;
      auVar38._8_4_ = fVar185 * fVar175;
      auVar38._12_4_ = fVar246 * fVar177;
      auVar38._16_4_ = fVar157 * fVar179;
      auVar38._20_4_ = fVar158 * fVar181;
      auVar38._24_4_ = fVar160 * fVar183;
      auVar38._28_4_ = auVar129._28_4_ + fVar197;
      auVar129 = vsubps_avx(auVar38,auVar37);
      auVar249._8_4_ = 0x7fffffff;
      auVar249._0_8_ = 0x7fffffff7fffffff;
      auVar249._12_4_ = 0x7fffffff;
      auVar249._16_4_ = 0x7fffffff;
      auVar249._20_4_ = 0x7fffffff;
      auVar249._24_4_ = 0x7fffffff;
      auVar249._28_4_ = 0x7fffffff;
      auVar253 = ZEXT436(0x7fffffff);
      auVar131._0_4_ =
           fVar213 * auVar171._0_4_ +
           (float)local_6020 * auVar129._0_4_ + (float)local_5f80._0_4_ * auVar169._0_4_;
      auVar131._4_4_ =
           fVar216 * auVar171._4_4_ +
           (float)auStack_601c._0_4_ * auVar129._4_4_ + (float)local_5f80._4_4_ * auVar169._4_4_;
      auVar131._8_4_ =
           fVar217 * auVar171._8_4_ +
           (float)auStack_601c._4_4_ * auVar129._8_4_ + fStack_5f78 * auVar169._8_4_;
      auVar131._12_4_ =
           fVar218 * auVar171._12_4_ + fStack_6014 * auVar129._12_4_ + fStack_5f74 * auVar169._12_4_
      ;
      auVar131._16_4_ =
           fVar219 * auVar171._16_4_ + fStack_6010 * auVar129._16_4_ + fStack_5f70 * auVar169._16_4_
      ;
      auVar131._20_4_ =
           fVar220 * auVar171._20_4_ + fStack_600c * auVar129._20_4_ + fStack_5f6c * auVar169._20_4_
      ;
      auVar131._24_4_ =
           fVar221 * auVar171._24_4_ + fStack_6008 * auVar129._24_4_ + fStack_5f68 * auVar169._24_4_
      ;
      auVar131._28_4_ = auVar169._28_4_ + auVar129._28_4_ + auVar169._28_4_;
      auVar214._0_4_ = auVar131._0_4_ + local_5900._0_4_ + auVar189._0_4_;
      auVar214._4_4_ = auVar131._4_4_ + local_5900._4_4_ + auVar189._4_4_;
      auVar214._8_4_ = auVar131._8_4_ + local_5900._8_4_ + auVar189._8_4_;
      auVar214._12_4_ = auVar131._12_4_ + local_5900._12_4_ + auVar189._12_4_;
      auVar214._16_4_ = auVar131._16_4_ + local_5900._16_4_ + auVar189._16_4_;
      auVar214._20_4_ = auVar131._20_4_ + local_5900._20_4_ + auVar189._20_4_;
      auVar214._24_4_ = auVar131._24_4_ + local_5900._24_4_ + auVar189._24_4_;
      auVar214._28_4_ = auVar131._28_4_ + local_5900._28_4_ + auVar189._28_4_;
      auVar129 = vminps_avx(local_5900,auVar189);
      auVar169 = vminps_avx(auVar129,auVar131);
      auVar129 = vandps_avx(auVar249,auVar214);
      fVar197 = auVar129._0_4_ * 1.1920929e-07;
      fVar213 = auVar129._4_4_ * 1.1920929e-07;
      auVar39._4_4_ = fVar213;
      auVar39._0_4_ = fVar197;
      fVar216 = auVar129._8_4_ * 1.1920929e-07;
      auVar39._8_4_ = fVar216;
      fVar217 = auVar129._12_4_ * 1.1920929e-07;
      auVar39._12_4_ = fVar217;
      fVar218 = auVar129._16_4_ * 1.1920929e-07;
      auVar39._16_4_ = fVar218;
      fVar219 = auVar129._20_4_ * 1.1920929e-07;
      auVar39._20_4_ = fVar219;
      fVar220 = auVar129._24_4_ * 1.1920929e-07;
      auVar39._24_4_ = fVar220;
      auVar39._28_4_ = 0x34000000;
      auVar200 = ZEXT3264(auVar39);
      auVar223._0_8_ = CONCAT44(fVar213,fVar197) ^ 0x8000000080000000;
      auVar223._8_4_ = -fVar216;
      auVar223._12_4_ = -fVar217;
      auVar223._16_4_ = -fVar218;
      auVar223._20_4_ = -fVar219;
      auVar223._24_4_ = -fVar220;
      auVar223._28_4_ = 0xb4000000;
      auVar169 = vcmpps_avx(auVar169,auVar223,5);
      auVar170 = vmaxps_avx(local_5900,auVar189);
      auVar170 = vmaxps_avx(auVar170,auVar131);
      auVar170 = vcmpps_avx(auVar170,auVar39,2);
      auVar170 = vorps_avx(auVar169,auVar170);
      auVar225 = ZEXT3264(auVar170);
      auStack_5f98 = auVar188._8_24_;
      local_5fa0 = lVar105;
      uVar104 = (ulong)*(uint *)(lVar103 + -0x20 + lVar105);
      auVar171 = auVar147 & auVar170;
      local_58a0 = pfVar7[uVar104];
      local_58c0 = pfVar7[uVar104 + 1];
      local_58e0 = pfVar7[uVar104 + 2];
      local_6024 = uVar5;
      local_6000 = auVar147;
      _local_5f80 = auVar248;
      fStack_58dc = local_58e0;
      fStack_58d8 = local_58e0;
      fStack_58d4 = local_58e0;
      fStack_58d0 = local_58e0;
      fStack_58cc = local_58e0;
      fStack_58c8 = local_58e0;
      fStack_58c4 = local_58e0;
      fStack_58bc = local_58c0;
      fStack_58b8 = local_58c0;
      fStack_58b4 = local_58c0;
      fStack_58b0 = local_58c0;
      fStack_58ac = local_58c0;
      fStack_58a8 = local_58c0;
      fStack_58a4 = local_58c0;
      fStack_589c = local_58a0;
      fStack_5898 = local_58a0;
      fStack_5894 = local_58a0;
      fStack_5890 = local_58a0;
      fStack_588c = local_58a0;
      fStack_5888 = local_58a0;
      fStack_5884 = local_58a0;
      if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar171 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar171 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar171 >> 0x7f,0) == '\0') &&
            (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar171 >> 0xbf,0) == '\0') &&
          (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar171[0x1f]) {
        auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
      }
      else {
        auVar40._4_4_ = fVar159 * fVar255;
        auVar40._0_4_ = fVar252 * fVar245;
        auVar40._8_4_ = fVar161 * fVar257;
        auVar40._12_4_ = fVar163 * fVar258;
        auVar40._16_4_ = fVar165 * fVar259;
        auVar40._20_4_ = fVar168 * fVar260;
        auVar40._24_4_ = fVar176 * fVar261;
        auVar40._28_4_ = local_58e0;
        auVar41._4_4_ = fVar122 * fVar198;
        auVar41._0_4_ = fVar121 * fVar195;
        auVar41._8_4_ = fVar123 * fVar202;
        auVar41._12_4_ = fVar124 * fVar204;
        auVar41._16_4_ = fVar125 * fVar206;
        auVar41._20_4_ = fVar127 * fVar208;
        auVar41._24_4_ = fVar128 * fVar210;
        auVar41._28_4_ = auVar169._28_4_;
        auVar188 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = fVar230 * fVar198;
        auVar42._0_4_ = fVar247 * fVar195;
        auVar42._8_4_ = fVar234 * fVar202;
        auVar42._12_4_ = fVar236 * fVar204;
        auVar42._16_4_ = fVar238 * fVar206;
        auVar42._20_4_ = fVar240 * fVar208;
        auVar42._24_4_ = fVar242 * fVar210;
        auVar42._28_4_ = 0x34000000;
        auVar43._4_4_ = fVar159 * fVar266;
        auVar43._0_4_ = fVar252 * fVar263;
        auVar43._8_4_ = fVar161 * fVar268;
        auVar43._12_4_ = fVar163 * fVar270;
        auVar43._16_4_ = fVar165 * fVar273;
        auVar43._20_4_ = fVar168 * fVar275;
        auVar43._24_4_ = fVar176 * fVar277;
        auVar43._28_4_ = auVar129._28_4_;
        auVar199 = vsubps_avx(auVar43,auVar42);
        auVar169 = vandps_avx(auVar249,auVar40);
        auVar171 = vandps_avx(auVar249,auVar42);
        auVar169 = vcmpps_avx(auVar169,auVar171,1);
        local_5ee0.field_0.x.field_0 = (vfloat_impl<8>)vblendvps_avx(auVar199,auVar188,auVar169);
        auVar44._4_4_ = fVar279 * fVar266;
        auVar44._0_4_ = fVar278 * fVar263;
        auVar44._8_4_ = fVar280 * fVar268;
        auVar44._12_4_ = fVar281 * fVar270;
        auVar44._16_4_ = fVar282 * fVar273;
        auVar44._20_4_ = fVar283 * fVar275;
        auVar44._24_4_ = fVar284 * fVar277;
        auVar44._28_4_ = auVar169._28_4_;
        auVar45._4_4_ = fVar279 * fVar255;
        auVar45._0_4_ = fVar278 * fVar245;
        auVar45._8_4_ = fVar280 * fVar257;
        auVar45._12_4_ = fVar281 * fVar258;
        auVar45._16_4_ = fVar282 * fVar259;
        auVar45._20_4_ = fVar283 * fVar260;
        auVar45._24_4_ = fVar284 * fVar261;
        auVar45._28_4_ = auVar188._28_4_;
        auVar46._4_4_ = fVar180 * fVar198;
        auVar46._0_4_ = fVar178 * fVar195;
        auVar46._8_4_ = fVar182 * fVar202;
        auVar46._12_4_ = fVar184 * fVar204;
        auVar46._16_4_ = fVar186 * fVar206;
        auVar46._20_4_ = fVar187 * fVar208;
        auVar46._24_4_ = fVar194 * fVar210;
        auVar46._28_4_ = auVar171._28_4_;
        auVar188 = vsubps_avx(auVar45,auVar46);
        auVar47._4_4_ = fVar143 * fVar198;
        auVar47._0_4_ = fVar167 * fVar195;
        auVar47._8_4_ = fVar185 * fVar202;
        auVar47._12_4_ = fVar246 * fVar204;
        auVar47._16_4_ = fVar157 * fVar206;
        auVar47._20_4_ = fVar158 * fVar208;
        auVar47._24_4_ = fVar160 * fVar210;
        auVar47._28_4_ = uVar110;
        auVar199 = vsubps_avx(auVar47,auVar44);
        auVar169 = vandps_avx(auVar249,auVar46);
        auVar171 = vandps_avx(auVar249,auVar44);
        auVar169 = vcmpps_avx(auVar169,auVar171,1);
        local_5ee0.field_0.y.field_0 = (vfloat_impl<8>)vblendvps_avx(auVar199,auVar188,auVar169);
        auVar48._4_4_ = fVar159 * fVar143;
        auVar48._0_4_ = fVar252 * fVar167;
        auVar48._8_4_ = fVar161 * fVar185;
        auVar48._12_4_ = fVar163 * fVar246;
        auVar48._16_4_ = fVar165 * fVar157;
        auVar48._20_4_ = fVar168 * fVar158;
        auVar48._24_4_ = fVar176 * fVar160;
        auVar48._28_4_ = auVar169._28_4_;
        auVar49._4_4_ = fVar180 * fVar159;
        auVar49._0_4_ = fVar178 * fVar252;
        auVar49._8_4_ = fVar182 * fVar161;
        auVar49._12_4_ = fVar184 * fVar163;
        auVar49._16_4_ = fVar186 * fVar165;
        auVar49._20_4_ = fVar187 * fVar168;
        auVar49._24_4_ = fVar194 * fVar176;
        auVar49._28_4_ = auVar188._28_4_;
        auVar50._4_4_ = fVar279 * fVar122;
        auVar50._0_4_ = fVar278 * fVar121;
        auVar50._8_4_ = fVar280 * fVar123;
        auVar50._12_4_ = fVar281 * fVar124;
        auVar50._16_4_ = fVar282 * fVar125;
        auVar50._20_4_ = fVar283 * fVar127;
        auVar50._24_4_ = fVar284 * fVar128;
        auVar50._28_4_ = auVar227._28_4_;
        auVar51._4_4_ = fVar279 * fVar230;
        auVar51._0_4_ = fVar278 * fVar247;
        auVar51._8_4_ = fVar280 * fVar234;
        auVar51._12_4_ = fVar281 * fVar236;
        auVar51._16_4_ = fVar282 * fVar238;
        auVar51._20_4_ = fVar283 * fVar240;
        auVar51._24_4_ = fVar284 * fVar242;
        auVar51._28_4_ = auVar228._28_4_;
        auVar188 = vsubps_avx(auVar49,auVar50);
        auVar199 = vsubps_avx(auVar51,auVar48);
        auVar169 = vandps_avx(auVar249,auVar50);
        auVar171 = vandps_avx(auVar249,auVar48);
        auVar171 = vcmpps_avx(auVar169,auVar171,1);
        local_5ee0.field_0.z.field_0 = (vfloat_impl<8>)vblendvps_avx(auVar199,auVar188,auVar171);
        auVar200 = ZEXT3264((undefined1  [32])local_5ee0.field_0.z.field_0);
        local_5d20._0_4_ = auVar100._0_4_;
        local_5d20._4_4_ = auVar100._4_4_;
        fStack_5d18 = auVar100._8_4_;
        fStack_5d14 = auVar100._12_4_;
        fStack_5d10 = auVar100._16_4_;
        fStack_5d0c = auVar100._20_4_;
        fStack_5d08 = auVar100._24_4_;
        fVar247 = local_5ee0._0_4_ * (float)local_5d20._0_4_ +
                  local_5ee0._64_4_ * (float)local_6020 +
                  local_5ee0._32_4_ * (float)local_5f80._0_4_;
        fVar197 = local_5ee0._4_4_ * (float)local_5d20._4_4_ +
                  local_5ee0._68_4_ * (float)auStack_601c._0_4_ +
                  local_5ee0._36_4_ * (float)local_5f80._4_4_;
        fVar121 = local_5ee0._8_4_ * fStack_5d18 +
                  local_5ee0._72_4_ * (float)auStack_601c._4_4_ + local_5ee0._40_4_ * fStack_5f78;
        fVar122 = local_5ee0._12_4_ * fStack_5d14 +
                  local_5ee0._76_4_ * fStack_6014 + local_5ee0._44_4_ * fStack_5f74;
        fVar123 = local_5ee0._16_4_ * fStack_5d10 +
                  local_5ee0._80_4_ * fStack_6010 + local_5ee0._48_4_ * fStack_5f70;
        fVar124 = local_5ee0._20_4_ * fStack_5d0c +
                  local_5ee0._84_4_ * fStack_600c + local_5ee0._52_4_ * fStack_5f6c;
        fVar125 = local_5ee0._24_4_ * fStack_5d08 +
                  local_5ee0._88_4_ * fStack_6008 + local_5ee0._56_4_ * fStack_5f68;
        fVar127 = auVar171._28_4_ + auVar199._28_4_ + auVar171._28_4_;
        auVar132._0_4_ = fVar247 + fVar247;
        auVar132._4_4_ = fVar197 + fVar197;
        auVar132._8_4_ = fVar121 + fVar121;
        auVar132._12_4_ = fVar122 + fVar122;
        auVar132._16_4_ = fVar123 + fVar123;
        auVar132._20_4_ = fVar124 + fVar124;
        auVar132._24_4_ = fVar125 + fVar125;
        auVar132._28_4_ = fVar127 + fVar127;
        fVar197 = local_5ee0._0_4_ * fVar262 +
                  local_5ee0._64_4_ * fVar4 + local_5ee0._32_4_ * fVar212;
        fVar121 = local_5ee0._4_4_ * fVar265 +
                  local_5ee0._68_4_ * fVar11 + local_5ee0._36_4_ * fVar231;
        fVar122 = local_5ee0._8_4_ * fVar267 +
                  local_5ee0._72_4_ * fVar12 + local_5ee0._40_4_ * fVar235;
        fVar123 = local_5ee0._12_4_ * fVar269 +
                  local_5ee0._76_4_ * fVar13 + local_5ee0._44_4_ * fVar237;
        fVar124 = local_5ee0._16_4_ * fVar271 +
                  local_5ee0._80_4_ * fVar14 + local_5ee0._48_4_ * fVar239;
        fVar125 = local_5ee0._20_4_ * fVar274 +
                  local_5ee0._84_4_ * fVar15 + local_5ee0._52_4_ * fVar241;
        fVar126 = local_5ee0._24_4_ * fVar276 +
                  local_5ee0._88_4_ * fVar126 + local_5ee0._56_4_ * fVar243;
        fVar127 = auVar188._28_4_ + fVar127 + auVar188._28_4_;
        auVar171 = vrcpps_avx(auVar132);
        fVar247 = auVar171._0_4_;
        fVar4 = auVar171._4_4_;
        auVar52._4_4_ = auVar132._4_4_ * fVar4;
        auVar52._0_4_ = auVar132._0_4_ * fVar247;
        fVar11 = auVar171._8_4_;
        auVar52._8_4_ = auVar132._8_4_ * fVar11;
        fVar12 = auVar171._12_4_;
        auVar52._12_4_ = auVar132._12_4_ * fVar12;
        fVar13 = auVar171._16_4_;
        auVar52._16_4_ = auVar132._16_4_ * fVar13;
        fVar14 = auVar171._20_4_;
        auVar52._20_4_ = auVar132._20_4_ * fVar14;
        fVar15 = auVar171._24_4_;
        auVar52._24_4_ = auVar132._24_4_ * fVar15;
        auVar52._28_4_ = auVar169._28_4_;
        auVar190._8_4_ = 0x3f800000;
        auVar190._0_8_ = 0x3f8000003f800000;
        auVar190._12_4_ = 0x3f800000;
        auVar190._16_4_ = 0x3f800000;
        auVar190._20_4_ = 0x3f800000;
        auVar190._24_4_ = 0x3f800000;
        auVar190._28_4_ = 0x3f800000;
        auVar169 = vsubps_avx(auVar190,auVar52);
        auVar146._0_4_ = (fVar197 + fVar197) * (fVar247 + fVar247 * auVar169._0_4_);
        auVar146._4_4_ = (fVar121 + fVar121) * (fVar4 + fVar4 * auVar169._4_4_);
        auVar146._8_4_ = (fVar122 + fVar122) * (fVar11 + fVar11 * auVar169._8_4_);
        auVar146._12_4_ = (fVar123 + fVar123) * (fVar12 + fVar12 * auVar169._12_4_);
        local_5e80._16_4_ = (fVar124 + fVar124) * (fVar13 + fVar13 * auVar169._16_4_);
        local_5e80._0_16_ = auVar146;
        local_5e80._20_4_ = (fVar125 + fVar125) * (fVar14 + fVar14 * auVar169._20_4_);
        local_5e80._24_4_ = (fVar126 + fVar126) * (fVar15 + fVar15 * auVar169._24_4_);
        local_5e80._28_4_ = fVar127 + fVar127;
        auVar169 = vcmpps_avx(local_5e80,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar171 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),local_5e80,2);
        auVar169 = vandps_avx(auVar171,auVar169);
        auVar171 = vcmpps_avx(auVar132,_DAT_01f7b000,4);
        auVar169 = vandps_avx(auVar171,auVar169);
        auVar144 = vpslld_avx(auVar169._0_16_,0x1f);
        auVar145 = vpsrad_avx(auVar144,0x1f);
        auVar144 = vpslld_avx(auVar169._16_16_,0x1f);
        auVar144 = vpsrad_avx(auVar144,0x1f);
        auVar133._16_16_ = auVar144;
        auVar133._0_16_ = auVar145;
        auVar147 = vandps_avx(auVar147,auVar170);
        auVar169 = auVar147 & auVar133;
        auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        local_5960 = auVar214;
        local_5940 = auVar129;
        local_5920 = auVar189;
        if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar169 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar169 >> 0x7f,0) == '\0') &&
              (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar169 >> 0xbf,0) == '\0') &&
            (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar169[0x1f]) {
          auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
        }
        else {
          auVar147 = vandps_avx(auVar133,auVar147);
          pGVar8 = (context->scene->geometries).items[uVar109].ptr;
          uVar5 = pGVar8->mask;
          auVar149._4_4_ = uVar5;
          auVar149._0_4_ = uVar5;
          auVar149._8_4_ = uVar5;
          auVar149._12_4_ = uVar5;
          auVar149._16_4_ = uVar5;
          auVar149._20_4_ = uVar5;
          auVar149._24_4_ = uVar5;
          auVar149._28_4_ = uVar5;
          auVar169 = vandps_avx(auVar149,*(undefined1 (*) [32])(ray + 0x120));
          auVar144 = vpcmpeqd_avx(auVar169._16_16_,ZEXT816(0) << 0x20);
          auVar145 = vpcmpeqd_avx(auVar169._0_16_,ZEXT816(0) << 0x20);
          auVar172._16_16_ = auVar144;
          auVar172._0_16_ = auVar146;
          auVar169 = vblendps_avx(ZEXT1632(auVar145),auVar172,0xf0);
          auVar170 = auVar147 & ~auVar169;
          auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
          if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar170 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar170 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar170 >> 0x7f,0) != '\0') ||
                (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar170 >> 0xbf,0) != '\0') ||
              (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar170[0x1f] < '\0') {
            _local_6020 = vandnps_avx(auVar169,auVar147);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (auVar253 = ZEXT436(0x7fffffff), pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)
               ) {
              auVar147 = vrcpps_avx(auVar214);
              fVar247 = auVar147._0_4_;
              fVar4 = auVar147._4_4_;
              auVar83._4_4_ = auVar214._4_4_ * fVar4;
              auVar83._0_4_ = auVar214._0_4_ * fVar247;
              fVar11 = auVar147._8_4_;
              auVar83._8_4_ = auVar214._8_4_ * fVar11;
              fVar12 = auVar147._12_4_;
              auVar83._12_4_ = auVar214._12_4_ * fVar12;
              fVar13 = auVar147._16_4_;
              auVar83._16_4_ = auVar214._16_4_ * fVar13;
              fVar14 = auVar147._20_4_;
              auVar83._20_4_ = auVar214._20_4_ * fVar14;
              fVar15 = auVar147._24_4_;
              auVar83._24_4_ = auVar214._24_4_ * fVar15;
              auVar83._28_4_ = auVar214._28_4_;
              auVar192._8_4_ = 0x3f800000;
              auVar192._0_8_ = 0x3f8000003f800000;
              auVar192._12_4_ = 0x3f800000;
              auVar192._16_4_ = 0x3f800000;
              auVar192._20_4_ = 0x3f800000;
              auVar192._24_4_ = 0x3f800000;
              auVar192._28_4_ = 0x3f800000;
              auVar169 = vsubps_avx(auVar192,auVar83);
              auVar136._0_4_ = fVar247 + fVar247 * auVar169._0_4_;
              auVar136._4_4_ = fVar4 + fVar4 * auVar169._4_4_;
              auVar136._8_4_ = fVar11 + fVar11 * auVar169._8_4_;
              auVar136._12_4_ = fVar12 + fVar12 * auVar169._12_4_;
              auVar136._16_4_ = fVar13 + fVar13 * auVar169._16_4_;
              auVar136._20_4_ = fVar14 + fVar14 * auVar169._20_4_;
              auVar136._24_4_ = fVar15 + fVar15 * auVar169._24_4_;
              auVar136._28_4_ = auVar147._28_4_ + auVar169._28_4_;
              auVar152._8_4_ = 0x219392ef;
              auVar152._0_8_ = 0x219392ef219392ef;
              auVar152._12_4_ = 0x219392ef;
              auVar152._16_4_ = 0x219392ef;
              auVar152._20_4_ = 0x219392ef;
              auVar152._24_4_ = 0x219392ef;
              auVar152._28_4_ = 0x219392ef;
              auVar129 = vcmpps_avx(auVar129,auVar152,5);
              auVar147 = vandps_avx(auVar129,auVar136);
              auVar84._4_4_ = auVar147._4_4_ * local_5900._4_4_;
              auVar84._0_4_ = auVar147._0_4_ * local_5900._0_4_;
              auVar84._8_4_ = auVar147._8_4_ * local_5900._8_4_;
              auVar84._12_4_ = auVar147._12_4_ * local_5900._12_4_;
              auVar84._16_4_ = auVar147._16_4_ * local_5900._16_4_;
              auVar84._20_4_ = auVar147._20_4_ * local_5900._20_4_;
              auVar84._24_4_ = auVar147._24_4_ * local_5900._24_4_;
              auVar84._28_4_ = auVar129._28_4_;
              auVar129 = vminps_avx(auVar84,auVar192);
              auVar85._4_4_ = auVar147._4_4_ * auVar189._4_4_;
              auVar85._0_4_ = auVar147._0_4_ * auVar189._0_4_;
              auVar85._8_4_ = auVar147._8_4_ * auVar189._8_4_;
              auVar85._12_4_ = auVar147._12_4_ * auVar189._12_4_;
              auVar85._16_4_ = auVar147._16_4_ * auVar189._16_4_;
              auVar85._20_4_ = auVar147._20_4_ * auVar189._20_4_;
              auVar85._24_4_ = auVar147._24_4_ * auVar189._24_4_;
              auVar85._28_4_ = auVar147._28_4_;
              auVar147 = vminps_avx(auVar85,auVar192);
              auVar169 = vsubps_avx(auVar192,auVar129);
              auVar170 = vsubps_avx(auVar192,auVar147);
              auVar144._8_8_ = uStack_5978;
              auVar144._0_8_ = local_5980;
              auVar94._16_8_ = uStack_5970;
              auVar94._0_16_ = auVar144;
              auVar94._24_8_ = uStack_5968;
              local_5e40 = vblendvps_avx(auVar129,auVar169,auVar94);
              local_5e60 = vblendvps_avx(auVar147,auVar170,auVar94);
              local_6060.valid = local_5be0;
              local_6060.geometryUserPtr = &local_5c40;
              local_6060.context = local_5c20;
              local_6060.ray = local_5c00;
              auVar147 = ZEXT1632(local_5ee0._64_16_);
              auVar225 = ZEXT1664(auVar144);
              auVar253 = (undefined1  [36])0x0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_6060,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_5ee0.field_0);
              auVar129 = vcmpps_avx(auVar147,auVar147,0xf);
              pRVar9 = context->user;
              local_5e20 = vshufps_avx(ZEXT416((uint)local_5f00._0_4_),
                                       ZEXT416((uint)local_5f00._0_4_),0);
              local_5e40._16_16_ = vshufps_avx(ZEXT416(local_6024),ZEXT416(local_6024),0);
              auVar146 = local_6020._0_16_;
              local_5e40._0_16_ = local_5e40._16_16_;
              local_5fa8[1] = auVar129;
              *local_5fa8 = auVar129;
              local_5e00 = pRVar9->instID[0];
              local_5de0 = pRVar9->instPrimID[0];
              _local_5f80 = *(undefined1 (*) [32])(ray + 0x100);
              auVar147 = vblendvps_avx(_local_5f80,(undefined1  [32])local_5c40,_local_6020);
              *(undefined1 (*) [32])(ray + 0x100) = auVar147;
              local_5fe0._0_32_ = _local_6020;
              local_6060.valid = (int *)local_5fe0;
              local_6060.geometryUserPtr = pGVar8->userPtr;
              local_6060.context = context->user;
              local_6060.hit = (RTCHitN *)&local_5ee0;
              local_6060.N = 8;
              local_5e10 = local_5e20;
              uStack_5dfc = local_5e00;
              uStack_5df8 = local_5e00;
              uStack_5df4 = local_5e00;
              uStack_5df0 = local_5e00;
              uStack_5dec = local_5e00;
              uStack_5de8 = local_5e00;
              uStack_5de4 = local_5e00;
              uStack_5ddc = local_5de0;
              uStack_5dd8 = local_5de0;
              uStack_5dd4 = local_5de0;
              uStack_5dd0 = local_5de0;
              uStack_5dcc = local_5de0;
              uStack_5dc8 = local_5de0;
              uStack_5dc4 = local_5de0;
              if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
                auVar144 = local_6020._16_16_;
                local_6060.ray = (RTCRayN *)ray;
              }
              else {
                auVar147 = ZEXT1632(auVar129._0_16_);
                auVar225 = ZEXT1664(auVar225._0_16_);
                auVar253 = (undefined1  [36])0x0;
                local_6060.ray = (RTCRayN *)ray;
                (*pGVar8->occlusionFilterN)(&local_6060);
                auVar129 = vcmpps_avx(auVar147,auVar147,0xf);
                auVar144 = local_5fe0._16_16_;
                auVar146 = local_5fe0._0_16_;
              }
              unaff_R14 = local_6068;
              auVar200 = ZEXT3264(auVar129);
              auVar145 = vpcmpeqd_avx(auVar146,(undefined1  [16])0x0);
              auVar16 = vpcmpeqd_avx(auVar144,(undefined1  [16])0x0);
              auVar138._16_16_ = auVar16;
              auVar138._0_16_ = auVar145;
              auVar147 = auVar129 & ~auVar138;
              auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar147 >> 0x7f,0) == '\0') &&
                    (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar147 >> 0xbf,0) == '\0') &&
                  (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar147[0x1f]) {
                local_6020 = (undefined1  [4])(auVar145._0_4_ ^ auVar129._0_4_);
                auStack_601c._0_4_ = auVar145._4_4_ ^ auVar129._4_4_;
                auStack_601c._4_4_ = auVar145._8_4_ ^ auVar129._8_4_;
                fStack_6014 = (float)(auVar145._12_4_ ^ auVar129._12_4_);
                fStack_6010 = (float)(auVar16._0_4_ ^ auVar129._16_4_);
                fStack_600c = (float)(auVar16._4_4_ ^ auVar129._20_4_);
                fStack_6008 = (float)(auVar16._8_4_ ^ auVar129._24_4_);
                register0x000012dc = auVar16._12_4_ ^ auVar129._28_4_;
              }
              else {
                p_Var10 = context->args->filter;
                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar147 = ZEXT1632(auVar129._0_16_);
                  auVar225 = ZEXT1664(auVar225._0_16_);
                  auVar253 = (undefined1  [36])0x0;
                  (*p_Var10)(&local_6060);
                  auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar147 = vcmpps_avx(auVar147,auVar147,0xf);
                  auVar200 = ZEXT3264(auVar147);
                  auVar144 = local_5fe0._16_16_;
                  auVar146 = local_5fe0._0_16_;
                }
                auVar146 = vpcmpeqd_avx(auVar146,(undefined1  [16])0x0);
                auVar144 = vpcmpeqd_avx(auVar144,(undefined1  [16])0x0);
                auVar118._16_16_ = auVar144;
                auVar118._0_16_ = auVar146;
                local_6020 = (undefined1  [4])(auVar146._0_4_ ^ auVar200._0_4_);
                auStack_601c._0_4_ = auVar146._4_4_ ^ auVar200._4_4_;
                auStack_601c._4_4_ = auVar146._8_4_ ^ auVar200._8_4_;
                fStack_6014 = (float)(auVar146._12_4_ ^ auVar200._12_4_);
                fStack_6010 = (float)(auVar144._0_4_ ^ auVar200._16_4_);
                fStack_600c = (float)(auVar144._4_4_ ^ auVar200._20_4_);
                fStack_6008 = (float)(auVar144._8_4_ ^ auVar200._24_4_);
                register0x000012dc = auVar144._12_4_ ^ auVar200._28_4_;
                auVar140._8_4_ = 0xff800000;
                auVar140._0_8_ = 0xff800000ff800000;
                auVar140._12_4_ = 0xff800000;
                auVar140._16_4_ = 0xff800000;
                auVar140._20_4_ = 0xff800000;
                auVar140._24_4_ = 0xff800000;
                auVar140._28_4_ = 0xff800000;
                auVar147 = vblendvps_avx(auVar140,*(undefined1 (*) [32])(local_6060.ray + 0x100),
                                         auVar118);
                *(undefined1 (*) [32])(local_6060.ray + 0x100) = auVar147;
              }
              auVar147 = vblendvps_avx(_local_5f80,*(undefined1 (*) [32])local_6030,_local_6020);
              *(undefined1 (*) [32])local_6030 = auVar147;
              lVar105 = local_5fa0;
              uVar108 = local_6070;
            }
            auVar147 = vandnps_avx(_local_6020,local_6000);
            auVar232 = ZEXT3264(auVar147);
          }
        }
      }
      auVar147 = auVar232._0_32_;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0x7f,0) == '\0') &&
            (auVar232 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar147 >> 0xbf,0) == '\0') &&
          (auVar232 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar232[0x1f]) break;
      auVar129 = *(undefined1 (*) [32])ray;
      auVar169 = *(undefined1 (*) [32])(ray + 0x20);
      auVar170 = *(undefined1 (*) [32])(ray + 0x40);
      auVar97._4_4_ = fStack_589c;
      auVar97._0_4_ = local_58a0;
      auVar97._8_4_ = fStack_5898;
      auVar97._12_4_ = fStack_5894;
      auVar97._16_4_ = fStack_5890;
      auVar97._20_4_ = fStack_588c;
      auVar97._24_4_ = fStack_5888;
      auVar97._28_4_ = fStack_5884;
      local_5f00 = vsubps_avx(auVar97,auVar129);
      auVar96._4_4_ = fStack_58bc;
      auVar96._0_4_ = local_58c0;
      auVar96._8_4_ = fStack_58b8;
      auVar96._12_4_ = fStack_58b4;
      auVar96._16_4_ = fStack_58b0;
      auVar96._20_4_ = fStack_58ac;
      auVar96._24_4_ = fStack_58a8;
      auVar96._28_4_ = fStack_58a4;
      local_5c60 = vsubps_avx(auVar96,auVar169);
      auVar95._4_4_ = fStack_58dc;
      auVar95._0_4_ = local_58e0;
      auVar95._8_4_ = fStack_58d8;
      auVar95._12_4_ = fStack_58d4;
      auVar95._16_4_ = fStack_58d0;
      auVar95._20_4_ = fStack_58cc;
      auVar95._24_4_ = fStack_58c8;
      auVar95._28_4_ = fStack_58c4;
      local_5c80 = vsubps_avx(auVar95,auVar170);
      auVar171 = vsubps_avx(local_5d80,auVar129);
      auVar188 = vsubps_avx(local_5da0,auVar169);
      auVar199 = vsubps_avx(local_5dc0,auVar170);
      auVar129 = vsubps_avx(local_5880,auVar129);
      auVar169 = vsubps_avx(local_5840,auVar169);
      auVar170 = vsubps_avx(local_5860,auVar170);
      local_5ca0 = vsubps_avx(auVar129,local_5f00);
      local_5cc0 = vsubps_avx(auVar169,local_5c60);
      local_5ce0 = vsubps_avx(auVar170,local_5c80);
      fVar247 = local_5c60._0_4_;
      fVar128 = auVar169._0_4_ + fVar247;
      fVar11 = local_5c60._4_4_;
      fVar213 = auVar169._4_4_ + fVar11;
      fVar13 = local_5c60._8_4_;
      fVar218 = auVar169._8_4_ + fVar13;
      fVar15 = local_5c60._12_4_;
      fVar220 = auVar169._12_4_ + fVar15;
      fVar197 = local_5c60._16_4_;
      fVar230 = auVar169._16_4_ + fVar197;
      fVar122 = local_5c60._20_4_;
      fVar236 = auVar169._20_4_ + fVar122;
      fVar124 = local_5c60._24_4_;
      fVar240 = auVar169._24_4_ + fVar124;
      fVar4 = local_5c80._0_4_;
      fVar244 = auVar170._0_4_ + fVar4;
      fVar12 = local_5c80._4_4_;
      fVar166 = auVar170._4_4_ + fVar12;
      fVar14 = local_5c80._8_4_;
      fVar175 = auVar170._8_4_ + fVar14;
      fVar126 = local_5c80._12_4_;
      fVar177 = auVar170._12_4_ + fVar126;
      fVar121 = local_5c80._16_4_;
      fVar179 = auVar170._16_4_ + fVar121;
      fVar123 = local_5c80._20_4_;
      fVar181 = auVar170._20_4_ + fVar123;
      fVar125 = local_5c80._24_4_;
      fVar183 = auVar170._24_4_ + fVar125;
      fVar127 = local_5c80._28_4_;
      fVar216 = local_5ce0._0_4_;
      auVar156._0_4_ = fVar128 * fVar216;
      fVar217 = local_5ce0._4_4_;
      auVar156._4_4_ = fVar213 * fVar217;
      fVar219 = local_5ce0._8_4_;
      auVar156._8_4_ = fVar218 * fVar219;
      fVar221 = local_5ce0._12_4_;
      auVar156._12_4_ = fVar220 * fVar221;
      fVar234 = local_5ce0._16_4_;
      auVar156._16_4_ = fVar230 * fVar234;
      fVar238 = local_5ce0._20_4_;
      auVar156._20_4_ = fVar236 * fVar238;
      fVar242 = local_5ce0._24_4_;
      auVar156._24_4_ = fVar240 * fVar242;
      auVar156._28_36_ = auVar253;
      fVar279 = local_5cc0._0_4_;
      auVar200._0_4_ = fVar279 * fVar244;
      fVar281 = local_5cc0._4_4_;
      auVar200._4_4_ = fVar281 * fVar166;
      fVar283 = local_5cc0._8_4_;
      auVar200._8_4_ = fVar283 * fVar175;
      fVar285 = local_5cc0._12_4_;
      auVar200._12_4_ = fVar285 * fVar177;
      fVar287 = local_5cc0._16_4_;
      auVar200._16_4_ = fVar287 * fVar179;
      fVar289 = local_5cc0._20_4_;
      auVar200._20_4_ = fVar289 * fVar181;
      auVar200._28_36_ = auVar254._28_36_;
      fVar291 = local_5cc0._24_4_;
      auVar200._24_4_ = fVar291 * fVar183;
      auVar222 = vsubps_avx(auVar200._0_32_,auVar156._0_32_);
      fVar231 = local_5f00._0_4_;
      fVar185 = fVar231 + auVar129._0_4_;
      fVar235 = local_5f00._4_4_;
      fVar246 = fVar235 + auVar129._4_4_;
      fVar237 = local_5f00._8_4_;
      fVar157 = fVar237 + auVar129._8_4_;
      fVar239 = local_5f00._12_4_;
      fVar158 = fVar239 + auVar129._12_4_;
      fVar241 = local_5f00._16_4_;
      fVar160 = fVar241 + auVar129._16_4_;
      fVar243 = local_5f00._20_4_;
      fVar162 = fVar243 + auVar129._20_4_;
      fVar245 = local_5f00._24_4_;
      fVar164 = fVar245 + auVar129._24_4_;
      fVar252 = local_5f00._28_4_ + auVar129._28_4_;
      fVar255 = local_5ca0._0_4_;
      fVar257 = local_5ca0._4_4_;
      auVar53._4_4_ = fVar257 * fVar166;
      auVar53._0_4_ = fVar255 * fVar244;
      fVar258 = local_5ca0._8_4_;
      auVar53._8_4_ = fVar258 * fVar175;
      fVar259 = local_5ca0._12_4_;
      auVar53._12_4_ = fVar259 * fVar177;
      fVar260 = local_5ca0._16_4_;
      auVar53._16_4_ = fVar260 * fVar179;
      fVar261 = local_5ca0._20_4_;
      auVar53._20_4_ = fVar261 * fVar181;
      fVar262 = local_5ca0._24_4_;
      auVar53._24_4_ = fVar262 * fVar183;
      auVar53._28_4_ = auVar170._28_4_ + fVar127;
      auVar54._4_4_ = fVar246 * fVar217;
      auVar54._0_4_ = fVar185 * fVar216;
      auVar54._8_4_ = fVar157 * fVar219;
      auVar54._12_4_ = fVar158 * fVar221;
      auVar54._16_4_ = fVar160 * fVar234;
      auVar54._20_4_ = fVar162 * fVar238;
      auVar54._24_4_ = fVar164 * fVar242;
      auVar54._28_4_ = auVar254._28_4_;
      auVar227 = vsubps_avx(auVar54,auVar53);
      auVar55._4_4_ = fVar246 * fVar281;
      auVar55._0_4_ = fVar185 * fVar279;
      auVar55._8_4_ = fVar157 * fVar283;
      auVar55._12_4_ = fVar158 * fVar285;
      auVar55._16_4_ = fVar160 * fVar287;
      auVar55._20_4_ = fVar162 * fVar289;
      auVar55._24_4_ = fVar164 * fVar291;
      auVar55._28_4_ = fVar252;
      auVar56._4_4_ = fVar257 * fVar213;
      auVar56._0_4_ = fVar255 * fVar128;
      auVar56._8_4_ = fVar258 * fVar218;
      auVar56._12_4_ = fVar259 * fVar220;
      auVar56._16_4_ = fVar260 * fVar230;
      auVar56._20_4_ = fVar261 * fVar236;
      auVar56._24_4_ = fVar262 * fVar240;
      auVar56._28_4_ = auVar169._28_4_ + local_5c60._28_4_;
      auVar228 = vsubps_avx(auVar56,auVar55);
      pRVar1 = ray + 0xc0;
      fVar166 = *(float *)pRVar1;
      fVar175 = *(float *)(ray + 0xc4);
      fVar177 = *(float *)(ray + 200);
      fVar179 = *(float *)(ray + 0xcc);
      fVar181 = *(float *)(ray + 0xd0);
      fVar183 = *(float *)(ray + 0xd4);
      fVar185 = *(float *)(ray + 0xd8);
      auVar99 = *(undefined1 (*) [28])pRVar1;
      pRVar2 = ray + 0xa0;
      auVar98 = *(undefined1 (*) [28])pRVar2;
      auVar248 = *(undefined1 (*) [32])pRVar2;
      pRVar3 = ray + 0x80;
      fVar246 = *(float *)pRVar3;
      fVar157 = *(float *)(ray + 0x84);
      fVar158 = *(float *)(ray + 0x88);
      fVar160 = *(float *)(ray + 0x8c);
      fVar162 = *(float *)(ray + 0x90);
      fVar164 = *(float *)(ray + 0x94);
      fVar167 = *(float *)(ray + 0x98);
      auVar100 = *(undefined1 (*) [28])pRVar3;
      _local_5d00 = *(undefined1 (*) [32])pRVar3;
      local_5d60._0_4_ =
           fVar246 * auVar222._0_4_ + fVar166 * auVar228._0_4_ + *(float *)pRVar2 * auVar227._0_4_;
      local_5d60._4_4_ =
           fVar157 * auVar222._4_4_ +
           fVar175 * auVar228._4_4_ + *(float *)(ray + 0xa4) * auVar227._4_4_;
      local_5d60._8_4_ =
           fVar158 * auVar222._8_4_ +
           fVar177 * auVar228._8_4_ + *(float *)(ray + 0xa8) * auVar227._8_4_;
      local_5d60._12_4_ =
           fVar160 * auVar222._12_4_ +
           fVar179 * auVar228._12_4_ + *(float *)(ray + 0xac) * auVar227._12_4_;
      local_5d60._16_4_ =
           fVar162 * auVar222._16_4_ +
           fVar181 * auVar228._16_4_ + *(float *)(ray + 0xb0) * auVar227._16_4_;
      local_5d60._20_4_ =
           fVar164 * auVar222._20_4_ +
           fVar183 * auVar228._20_4_ + *(float *)(ray + 0xb4) * auVar227._20_4_;
      local_5d60._24_4_ =
           fVar167 * auVar222._24_4_ +
           fVar185 * auVar228._24_4_ + *(float *)(ray + 0xb8) * auVar227._24_4_;
      local_5d60._28_4_ = auVar227._28_4_ + auVar228._28_4_ + auVar227._28_4_;
      _local_5d20 = vsubps_avx(local_5c60,auVar188);
      auVar222 = vsubps_avx(local_5c80,auVar199);
      fVar218 = fVar247 + auVar188._0_4_;
      fVar220 = fVar11 + auVar188._4_4_;
      fVar230 = fVar13 + auVar188._8_4_;
      fVar236 = fVar15 + auVar188._12_4_;
      fVar240 = fVar197 + auVar188._16_4_;
      fVar244 = fVar122 + auVar188._20_4_;
      fVar143 = fVar124 + auVar188._24_4_;
      fVar128 = auVar188._28_4_;
      fVar196 = fVar4 + auVar199._0_4_;
      fVar201 = fVar12 + auVar199._4_4_;
      fVar203 = fVar14 + auVar199._8_4_;
      fVar205 = fVar126 + auVar199._12_4_;
      fVar207 = fVar121 + auVar199._16_4_;
      fVar209 = fVar123 + auVar199._20_4_;
      fVar211 = fVar125 + auVar199._24_4_;
      fVar213 = auVar199._28_4_;
      fVar271 = auVar222._0_4_;
      fVar273 = auVar222._4_4_;
      auVar57._4_4_ = fVar273 * fVar220;
      auVar57._0_4_ = fVar271 * fVar218;
      fVar274 = auVar222._8_4_;
      auVar57._8_4_ = fVar274 * fVar230;
      fVar275 = auVar222._12_4_;
      auVar57._12_4_ = fVar275 * fVar236;
      fVar276 = auVar222._16_4_;
      auVar57._16_4_ = fVar276 * fVar240;
      fVar277 = auVar222._20_4_;
      auVar57._20_4_ = fVar277 * fVar244;
      fVar278 = auVar222._24_4_;
      auVar57._24_4_ = fVar278 * fVar143;
      auVar57._28_4_ = local_5cc0._28_4_;
      fVar198 = local_5d20._0_4_;
      fVar202 = local_5d20._4_4_;
      auVar58._4_4_ = fVar202 * fVar201;
      auVar58._0_4_ = fVar198 * fVar196;
      fVar204 = local_5d20._8_4_;
      auVar58._8_4_ = fVar204 * fVar203;
      fVar206 = local_5d20._12_4_;
      auVar58._12_4_ = fVar206 * fVar205;
      fVar208 = local_5d20._16_4_;
      auVar58._16_4_ = fVar208 * fVar207;
      fVar210 = local_5d20._20_4_;
      auVar58._20_4_ = fVar210 * fVar209;
      fVar212 = local_5d20._24_4_;
      auVar58._24_4_ = fVar212 * fVar211;
      auVar58._28_4_ = fVar127;
      auVar222 = vsubps_avx(auVar58,auVar57);
      auVar227 = vsubps_avx(local_5f00,auVar171);
      fVar263 = auVar227._0_4_;
      fVar265 = auVar227._4_4_;
      auVar59._4_4_ = fVar265 * fVar201;
      auVar59._0_4_ = fVar263 * fVar196;
      fVar266 = auVar227._8_4_;
      auVar59._8_4_ = fVar266 * fVar203;
      fVar267 = auVar227._12_4_;
      auVar59._12_4_ = fVar267 * fVar205;
      fVar268 = auVar227._16_4_;
      auVar59._16_4_ = fVar268 * fVar207;
      fVar269 = auVar227._20_4_;
      auVar59._20_4_ = fVar269 * fVar209;
      fVar270 = auVar227._24_4_;
      auVar59._24_4_ = fVar270 * fVar211;
      auVar59._28_4_ = fVar127 + fVar213;
      fVar127 = fVar231 + auVar171._0_4_;
      fVar196 = fVar235 + auVar171._4_4_;
      fVar201 = fVar237 + auVar171._8_4_;
      fVar203 = fVar239 + auVar171._12_4_;
      fVar205 = fVar241 + auVar171._16_4_;
      fVar207 = fVar243 + auVar171._20_4_;
      fVar209 = fVar245 + auVar171._24_4_;
      auVar60._4_4_ = fVar196 * fVar273;
      auVar60._0_4_ = fVar127 * fVar271;
      auVar60._8_4_ = fVar201 * fVar274;
      auVar60._12_4_ = fVar203 * fVar275;
      auVar60._16_4_ = fVar205 * fVar276;
      auVar60._20_4_ = fVar207 * fVar277;
      auVar60._24_4_ = fVar209 * fVar278;
      auVar60._28_4_ = fVar252;
      auVar227 = vsubps_avx(auVar60,auVar59);
      auVar61._4_4_ = fVar196 * fVar202;
      auVar61._0_4_ = fVar127 * fVar198;
      auVar61._8_4_ = fVar201 * fVar204;
      auVar61._12_4_ = fVar203 * fVar206;
      auVar61._16_4_ = fVar205 * fVar208;
      auVar61._20_4_ = fVar207 * fVar210;
      auVar61._24_4_ = fVar209 * fVar212;
      auVar61._28_4_ = local_5f00._28_4_ + auVar171._28_4_;
      auVar62._4_4_ = fVar265 * fVar220;
      auVar62._0_4_ = fVar263 * fVar218;
      auVar62._8_4_ = fVar266 * fVar230;
      auVar62._12_4_ = fVar267 * fVar236;
      auVar62._16_4_ = fVar268 * fVar240;
      auVar62._20_4_ = fVar269 * fVar244;
      auVar62._24_4_ = fVar270 * fVar143;
      auVar62._28_4_ = local_5c60._28_4_ + fVar128;
      auVar228 = vsubps_avx(auVar62,auVar61);
      local_5f80._0_4_ = auVar98._0_4_;
      local_5f80._4_4_ = auVar98._4_4_;
      fStack_5f78 = auVar98._8_4_;
      fStack_5f74 = auVar98._12_4_;
      fStack_5f70 = auVar98._16_4_;
      fStack_5f6c = auVar98._20_4_;
      fStack_5f68 = auVar98._24_4_;
      auVar250._0_4_ =
           fVar246 * auVar222._0_4_ +
           fVar166 * auVar228._0_4_ + (float)local_5f80._0_4_ * auVar227._0_4_;
      auVar250._4_4_ =
           fVar157 * auVar222._4_4_ +
           fVar175 * auVar228._4_4_ + (float)local_5f80._4_4_ * auVar227._4_4_;
      auVar250._8_4_ =
           fVar158 * auVar222._8_4_ + fVar177 * auVar228._8_4_ + fStack_5f78 * auVar227._8_4_;
      auVar250._12_4_ =
           fVar160 * auVar222._12_4_ + fVar179 * auVar228._12_4_ + fStack_5f74 * auVar227._12_4_;
      auVar250._16_4_ =
           fVar162 * auVar222._16_4_ + fVar181 * auVar228._16_4_ + fStack_5f70 * auVar227._16_4_;
      auVar250._20_4_ =
           fVar164 * auVar222._20_4_ + fVar183 * auVar228._20_4_ + fStack_5f6c * auVar227._20_4_;
      auVar250._24_4_ =
           fVar167 * auVar222._24_4_ + fVar185 * auVar228._24_4_ + fStack_5f68 * auVar227._24_4_;
      auVar250._28_4_ = auVar227._28_4_ + auVar228._28_4_ + auVar227._28_4_;
      auVar222 = vsubps_avx(auVar171,auVar129);
      fVar209 = auVar171._0_4_ + auVar129._0_4_;
      fVar211 = auVar171._4_4_ + auVar129._4_4_;
      fVar252 = auVar171._8_4_ + auVar129._8_4_;
      fVar159 = auVar171._12_4_ + auVar129._12_4_;
      fVar161 = auVar171._16_4_ + auVar129._16_4_;
      fVar163 = auVar171._20_4_ + auVar129._20_4_;
      fVar165 = auVar171._24_4_ + auVar129._24_4_;
      auVar227 = vsubps_avx(auVar188,auVar169);
      fVar168 = auVar169._0_4_ + auVar188._0_4_;
      fVar176 = auVar169._4_4_ + auVar188._4_4_;
      fVar178 = auVar169._8_4_ + auVar188._8_4_;
      fVar180 = auVar169._12_4_ + auVar188._12_4_;
      fVar182 = auVar169._16_4_ + auVar188._16_4_;
      fVar184 = auVar169._20_4_ + auVar188._20_4_;
      fVar186 = auVar169._24_4_ + auVar188._24_4_;
      fVar187 = auVar169._28_4_ + fVar128;
      auVar188 = vsubps_avx(auVar199,auVar170);
      auVar200 = ZEXT3264(auVar188);
      fVar196 = auVar199._0_4_ + auVar170._0_4_;
      fVar201 = auVar199._4_4_ + auVar170._4_4_;
      fVar203 = auVar199._8_4_ + auVar170._8_4_;
      fVar205 = auVar199._12_4_ + auVar170._12_4_;
      fVar207 = auVar199._16_4_ + auVar170._16_4_;
      fVar194 = auVar199._20_4_ + auVar170._20_4_;
      fVar195 = auVar199._24_4_ + auVar170._24_4_;
      fVar127 = auVar188._0_4_;
      fVar218 = auVar188._4_4_;
      auVar63._4_4_ = fVar176 * fVar218;
      auVar63._0_4_ = fVar168 * fVar127;
      fVar220 = auVar188._8_4_;
      auVar63._8_4_ = fVar178 * fVar220;
      fVar230 = auVar188._12_4_;
      auVar63._12_4_ = fVar180 * fVar230;
      fVar236 = auVar188._16_4_;
      auVar63._16_4_ = fVar182 * fVar236;
      fVar240 = auVar188._20_4_;
      auVar63._20_4_ = fVar184 * fVar240;
      fVar244 = auVar188._24_4_;
      auVar63._24_4_ = fVar186 * fVar244;
      auVar63._28_4_ = fVar128;
      fVar280 = auVar227._0_4_;
      fVar282 = auVar227._4_4_;
      auVar64._4_4_ = fVar282 * fVar201;
      auVar64._0_4_ = fVar280 * fVar196;
      fVar284 = auVar227._8_4_;
      auVar64._8_4_ = fVar284 * fVar203;
      fVar286 = auVar227._12_4_;
      auVar64._12_4_ = fVar286 * fVar205;
      fVar288 = auVar227._16_4_;
      auVar64._16_4_ = fVar288 * fVar207;
      fVar290 = auVar227._20_4_;
      auVar64._20_4_ = fVar290 * fVar194;
      fVar292 = auVar227._24_4_;
      auVar64._24_4_ = fVar292 * fVar195;
      auVar64._28_4_ = fVar213;
      auVar169 = vsubps_avx(auVar64,auVar63);
      fVar128 = auVar222._0_4_;
      fVar143 = auVar222._4_4_;
      auVar65._4_4_ = fVar143 * fVar201;
      auVar65._0_4_ = fVar128 * fVar196;
      fVar196 = auVar222._8_4_;
      auVar65._8_4_ = fVar196 * fVar203;
      fVar201 = auVar222._12_4_;
      auVar65._12_4_ = fVar201 * fVar205;
      fVar203 = auVar222._16_4_;
      auVar65._16_4_ = fVar203 * fVar207;
      fVar205 = auVar222._20_4_;
      auVar65._20_4_ = fVar205 * fVar194;
      fVar207 = auVar222._24_4_;
      auVar65._24_4_ = fVar207 * fVar195;
      auVar65._28_4_ = fVar213 + auVar170._28_4_;
      auVar66._4_4_ = fVar211 * fVar218;
      auVar66._0_4_ = fVar209 * fVar127;
      auVar66._8_4_ = fVar252 * fVar220;
      auVar66._12_4_ = fVar159 * fVar230;
      auVar66._16_4_ = fVar161 * fVar236;
      auVar66._20_4_ = fVar163 * fVar240;
      auVar66._24_4_ = fVar165 * fVar244;
      auVar66._28_4_ = fVar213;
      auVar170 = vsubps_avx(auVar66,auVar65);
      auVar67._4_4_ = fVar282 * fVar211;
      auVar67._0_4_ = fVar280 * fVar209;
      auVar67._8_4_ = fVar284 * fVar252;
      auVar67._12_4_ = fVar286 * fVar159;
      auVar67._16_4_ = fVar288 * fVar161;
      auVar67._20_4_ = fVar290 * fVar163;
      auVar67._24_4_ = fVar292 * fVar165;
      auVar67._28_4_ = auVar171._28_4_ + auVar129._28_4_;
      auVar68._4_4_ = fVar143 * fVar176;
      auVar68._0_4_ = fVar128 * fVar168;
      auVar68._8_4_ = fVar196 * fVar178;
      auVar68._12_4_ = fVar201 * fVar180;
      auVar68._16_4_ = fVar203 * fVar182;
      auVar68._20_4_ = fVar205 * fVar184;
      auVar68._24_4_ = fVar207 * fVar186;
      auVar68._28_4_ = fVar187;
      auVar129 = vsubps_avx(auVar68,auVar67);
      auVar150._0_4_ =
           fVar246 * auVar169._0_4_ +
           fVar166 * auVar129._0_4_ + (float)local_5f80._0_4_ * auVar170._0_4_;
      auVar150._4_4_ =
           fVar157 * auVar169._4_4_ +
           fVar175 * auVar129._4_4_ + (float)local_5f80._4_4_ * auVar170._4_4_;
      auVar150._8_4_ =
           fVar158 * auVar169._8_4_ + fVar177 * auVar129._8_4_ + fStack_5f78 * auVar170._8_4_;
      auVar150._12_4_ =
           fVar160 * auVar169._12_4_ + fVar179 * auVar129._12_4_ + fStack_5f74 * auVar170._12_4_;
      auVar150._16_4_ =
           fVar162 * auVar169._16_4_ + fVar181 * auVar129._16_4_ + fStack_5f70 * auVar170._16_4_;
      auVar150._20_4_ =
           fVar164 * auVar169._20_4_ + fVar183 * auVar129._20_4_ + fStack_5f6c * auVar170._20_4_;
      auVar150._24_4_ =
           fVar167 * auVar169._24_4_ + fVar185 * auVar129._24_4_ + fStack_5f68 * auVar170._24_4_;
      auVar150._28_4_ = fVar187 + auVar129._28_4_ + fVar187;
      auVar224._0_4_ = auVar150._0_4_ + local_5d60._0_4_ + auVar250._0_4_;
      auVar224._4_4_ = auVar150._4_4_ + local_5d60._4_4_ + auVar250._4_4_;
      auVar224._8_4_ = auVar150._8_4_ + local_5d60._8_4_ + auVar250._8_4_;
      auVar224._12_4_ = auVar150._12_4_ + local_5d60._12_4_ + auVar250._12_4_;
      auVar224._16_4_ = auVar150._16_4_ + local_5d60._16_4_ + auVar250._16_4_;
      auVar224._20_4_ = auVar150._20_4_ + local_5d60._20_4_ + auVar250._20_4_;
      auVar224._24_4_ = auVar150._24_4_ + local_5d60._24_4_ + auVar250._24_4_;
      auVar224._28_4_ = auVar150._28_4_ + local_5d60._28_4_ + auVar250._28_4_;
      auVar225 = ZEXT3264(auVar224);
      auVar129 = vminps_avx(local_5d60,auVar250);
      auVar129 = vminps_avx(auVar129,auVar150);
      auVar229._8_4_ = 0x7fffffff;
      auVar229._0_8_ = 0x7fffffff7fffffff;
      auVar229._12_4_ = 0x7fffffff;
      auVar229._16_4_ = 0x7fffffff;
      auVar229._20_4_ = 0x7fffffff;
      auVar229._24_4_ = 0x7fffffff;
      auVar229._28_4_ = 0x7fffffff;
      local_5d80 = vandps_avx(auVar229,auVar224);
      fVar213 = local_5d80._0_4_ * 1.1920929e-07;
      fVar166 = local_5d80._4_4_ * 1.1920929e-07;
      auVar69._4_4_ = fVar166;
      auVar69._0_4_ = fVar213;
      fVar175 = local_5d80._8_4_ * 1.1920929e-07;
      auVar69._8_4_ = fVar175;
      fVar177 = local_5d80._12_4_ * 1.1920929e-07;
      auVar69._12_4_ = fVar177;
      fVar179 = local_5d80._16_4_ * 1.1920929e-07;
      auVar69._16_4_ = fVar179;
      fVar181 = local_5d80._20_4_ * 1.1920929e-07;
      auVar69._20_4_ = fVar181;
      fVar183 = local_5d80._24_4_ * 1.1920929e-07;
      auVar69._24_4_ = fVar183;
      auVar69._28_4_ = 0x34000000;
      auVar215._0_8_ = CONCAT44(fVar166,fVar213) ^ 0x8000000080000000;
      auVar215._8_4_ = -fVar175;
      auVar215._12_4_ = -fVar177;
      auVar215._16_4_ = -fVar179;
      auVar215._20_4_ = -fVar181;
      auVar215._24_4_ = -fVar183;
      auVar215._28_4_ = 0xb4000000;
      auVar129 = vcmpps_avx(auVar129,auVar215,5);
      auVar169 = vmaxps_avx(local_5d60,auVar250);
      auVar169 = vmaxps_avx(auVar169,auVar150);
      auVar169 = vcmpps_avx(auVar169,auVar69,2);
      auVar169 = vorps_avx(auVar129,auVar169);
      auVar156 = ZEXT3264(auVar147);
      auVar170 = auVar147 & auVar169;
      local_6000 = auVar147;
      _local_5f80 = auVar248;
      if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar170 >> 0x7f,0) == '\0') &&
            (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar170 >> 0xbf,0) == '\0') &&
          (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar170[0x1f]) {
        auVar251 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
      }
      else {
        auVar70._4_4_ = fVar217 * fVar202;
        auVar70._0_4_ = fVar216 * fVar198;
        auVar70._8_4_ = fVar219 * fVar204;
        auVar70._12_4_ = fVar221 * fVar206;
        auVar70._16_4_ = fVar234 * fVar208;
        auVar70._20_4_ = fVar238 * fVar210;
        auVar70._24_4_ = fVar242 * fVar212;
        auVar70._28_4_ = auVar232._28_4_;
        auVar71._4_4_ = fVar281 * fVar273;
        auVar71._0_4_ = fVar279 * fVar271;
        auVar71._8_4_ = fVar283 * fVar274;
        auVar71._12_4_ = fVar285 * fVar275;
        auVar71._16_4_ = fVar287 * fVar276;
        auVar71._20_4_ = fVar289 * fVar277;
        auVar71._24_4_ = fVar291 * fVar278;
        auVar71._28_4_ = auVar129._28_4_;
        auVar171 = vsubps_avx(auVar71,auVar70);
        auVar72._4_4_ = fVar282 * fVar273;
        auVar72._0_4_ = fVar280 * fVar271;
        auVar72._8_4_ = fVar284 * fVar274;
        auVar72._12_4_ = fVar286 * fVar275;
        auVar72._16_4_ = fVar288 * fVar276;
        auVar72._20_4_ = fVar290 * fVar277;
        auVar72._24_4_ = fVar292 * fVar278;
        auVar72._28_4_ = 0x34000000;
        auVar73._4_4_ = fVar202 * fVar218;
        auVar73._0_4_ = fVar198 * fVar127;
        auVar73._8_4_ = fVar204 * fVar220;
        auVar73._12_4_ = fVar206 * fVar230;
        auVar73._16_4_ = fVar208 * fVar236;
        auVar73._20_4_ = fVar210 * fVar240;
        auVar73._24_4_ = fVar212 * fVar244;
        auVar73._28_4_ = auVar224._28_4_;
        auVar199 = vsubps_avx(auVar73,auVar72);
        auVar225 = ZEXT3264(auVar199);
        auVar129 = vandps_avx(auVar229,auVar70);
        auVar170 = vandps_avx(auVar229,auVar72);
        auVar129 = vcmpps_avx(auVar129,auVar170,1);
        local_5ee0.field_0.x.field_0 = (vfloat_impl<8>)vblendvps_avx(auVar199,auVar171,auVar129);
        auVar74._4_4_ = fVar265 * fVar218;
        auVar74._0_4_ = fVar263 * fVar127;
        auVar74._8_4_ = fVar266 * fVar220;
        auVar74._12_4_ = fVar267 * fVar230;
        auVar74._16_4_ = fVar268 * fVar236;
        auVar74._20_4_ = fVar269 * fVar240;
        auVar74._24_4_ = fVar270 * fVar244;
        auVar74._28_4_ = auVar129._28_4_;
        auVar75._4_4_ = fVar265 * fVar217;
        auVar75._0_4_ = fVar263 * fVar216;
        auVar75._8_4_ = fVar266 * fVar219;
        auVar75._12_4_ = fVar267 * fVar221;
        auVar75._16_4_ = fVar268 * fVar234;
        auVar75._20_4_ = fVar269 * fVar238;
        auVar75._24_4_ = fVar270 * fVar242;
        auVar75._28_4_ = auVar171._28_4_;
        auVar76._4_4_ = fVar257 * fVar273;
        auVar76._0_4_ = fVar255 * fVar271;
        auVar76._8_4_ = fVar258 * fVar274;
        auVar76._12_4_ = fVar259 * fVar275;
        auVar76._16_4_ = fVar260 * fVar276;
        auVar76._20_4_ = fVar261 * fVar277;
        auVar76._24_4_ = fVar262 * fVar278;
        auVar76._28_4_ = auVar170._28_4_;
        auVar171 = vsubps_avx(auVar75,auVar76);
        auVar77._4_4_ = fVar273 * fVar143;
        auVar77._0_4_ = fVar271 * fVar128;
        auVar77._8_4_ = fVar274 * fVar196;
        auVar77._12_4_ = fVar275 * fVar201;
        auVar77._16_4_ = fVar276 * fVar203;
        auVar77._20_4_ = fVar277 * fVar205;
        auVar77._24_4_ = fVar278 * fVar207;
        auVar77._28_4_ = auVar188._28_4_;
        auVar188 = vsubps_avx(auVar77,auVar74);
        auVar129 = vandps_avx(auVar229,auVar76);
        auVar170 = vandps_avx(auVar229,auVar74);
        auVar129 = vcmpps_avx(auVar129,auVar170,1);
        local_5ee0.field_0.y.field_0 = (vfloat_impl<8>)vblendvps_avx(auVar188,auVar171,auVar129);
        auVar78._4_4_ = fVar143 * fVar202;
        auVar78._0_4_ = fVar128 * fVar198;
        auVar78._8_4_ = fVar196 * fVar204;
        auVar78._12_4_ = fVar201 * fVar206;
        auVar78._16_4_ = fVar203 * fVar208;
        auVar78._20_4_ = fVar205 * fVar210;
        auVar78._24_4_ = fVar207 * fVar212;
        auVar78._28_4_ = auVar222._28_4_;
        auVar79._4_4_ = fVar257 * fVar202;
        auVar79._0_4_ = fVar255 * fVar198;
        auVar79._8_4_ = fVar258 * fVar204;
        auVar79._12_4_ = fVar259 * fVar206;
        auVar79._16_4_ = fVar260 * fVar208;
        auVar79._20_4_ = fVar261 * fVar210;
        auVar79._24_4_ = fVar262 * fVar212;
        auVar79._28_4_ = auVar129._28_4_;
        auVar80._4_4_ = fVar265 * fVar281;
        auVar80._0_4_ = fVar263 * fVar279;
        auVar80._8_4_ = fVar266 * fVar283;
        auVar80._12_4_ = fVar267 * fVar285;
        auVar80._16_4_ = fVar268 * fVar287;
        auVar80._20_4_ = fVar269 * fVar289;
        auVar80._24_4_ = fVar270 * fVar291;
        auVar80._28_4_ = auVar171._28_4_;
        auVar81._4_4_ = fVar265 * fVar282;
        auVar81._0_4_ = fVar263 * fVar280;
        auVar81._8_4_ = fVar266 * fVar284;
        auVar81._12_4_ = fVar267 * fVar286;
        auVar81._16_4_ = fVar268 * fVar288;
        auVar81._20_4_ = fVar269 * fVar290;
        auVar81._24_4_ = fVar270 * fVar292;
        auVar81._28_4_ = uStack_5d04;
        auVar171 = vsubps_avx(auVar79,auVar80);
        auVar188 = vsubps_avx(auVar81,auVar78);
        auVar129 = vandps_avx(auVar229,auVar80);
        auVar170 = vandps_avx(auVar229,auVar78);
        auVar170 = vcmpps_avx(auVar129,auVar170,1);
        local_5ee0.field_0.z.field_0 = (vfloat_impl<8>)vblendvps_avx(auVar188,auVar171,auVar170);
        auVar200 = ZEXT3264((undefined1  [32])local_5ee0.field_0.z.field_0);
        local_6020 = auVar99._0_4_;
        auStack_601c._0_4_ = auVar99._4_4_;
        auStack_601c._4_4_ = auVar99._8_4_;
        fStack_6014 = auVar99._12_4_;
        fStack_6010 = auVar99._16_4_;
        fStack_600c = auVar99._20_4_;
        fStack_6008 = auVar99._24_4_;
        local_5d00._0_4_ = auVar100._0_4_;
        local_5d00._4_4_ = auVar100._4_4_;
        fStack_5cf8 = auVar100._8_4_;
        fStack_5cf4 = auVar100._12_4_;
        fStack_5cf0 = auVar100._16_4_;
        fStack_5cec = auVar100._20_4_;
        fStack_5ce8 = auVar100._24_4_;
        fVar127 = local_5ee0._0_4_ * (float)local_5d00._0_4_ +
                  local_5ee0._64_4_ * (float)local_6020 +
                  (float)local_5f80._0_4_ * local_5ee0._32_4_;
        fVar128 = local_5ee0._4_4_ * (float)local_5d00._4_4_ +
                  local_5ee0._68_4_ * (float)auStack_601c._0_4_ +
                  (float)local_5f80._4_4_ * local_5ee0._36_4_;
        fVar213 = local_5ee0._8_4_ * fStack_5cf8 +
                  local_5ee0._72_4_ * (float)auStack_601c._4_4_ + fStack_5f78 * local_5ee0._40_4_;
        fVar216 = local_5ee0._12_4_ * fStack_5cf4 +
                  local_5ee0._76_4_ * fStack_6014 + fStack_5f74 * local_5ee0._44_4_;
        fVar217 = local_5ee0._16_4_ * fStack_5cf0 +
                  local_5ee0._80_4_ * fStack_6010 + fStack_5f70 * local_5ee0._48_4_;
        fVar218 = local_5ee0._20_4_ * fStack_5cec +
                  local_5ee0._84_4_ * fStack_600c + fStack_5f6c * local_5ee0._52_4_;
        fVar219 = local_5ee0._24_4_ * fStack_5ce8 +
                  local_5ee0._88_4_ * fStack_6008 + fStack_5f68 * local_5ee0._56_4_;
        fVar220 = auVar170._28_4_ + auVar188._28_4_ + auVar170._28_4_;
        auVar134._0_4_ = fVar127 + fVar127;
        auVar134._4_4_ = fVar128 + fVar128;
        auVar134._8_4_ = fVar213 + fVar213;
        auVar134._12_4_ = fVar216 + fVar216;
        auVar134._16_4_ = fVar217 + fVar217;
        auVar134._20_4_ = fVar218 + fVar218;
        auVar134._24_4_ = fVar219 + fVar219;
        auVar134._28_4_ = fVar220 + fVar220;
        fVar127 = local_5ee0._0_4_ * fVar231 +
                  local_5ee0._64_4_ * fVar4 + local_5ee0._32_4_ * fVar247;
        fVar128 = local_5ee0._4_4_ * fVar235 +
                  local_5ee0._68_4_ * fVar12 + local_5ee0._36_4_ * fVar11;
        fVar213 = local_5ee0._8_4_ * fVar237 +
                  local_5ee0._72_4_ * fVar14 + local_5ee0._40_4_ * fVar13;
        fVar126 = local_5ee0._12_4_ * fVar239 +
                  local_5ee0._76_4_ * fVar126 + local_5ee0._44_4_ * fVar15;
        fVar197 = local_5ee0._16_4_ * fVar241 +
                  local_5ee0._80_4_ * fVar121 + local_5ee0._48_4_ * fVar197;
        fVar121 = local_5ee0._20_4_ * fVar243 +
                  local_5ee0._84_4_ * fVar123 + local_5ee0._52_4_ * fVar122;
        fVar122 = local_5ee0._24_4_ * fVar245 +
                  local_5ee0._88_4_ * fVar125 + local_5ee0._56_4_ * fVar124;
        fVar123 = auVar171._28_4_ + fVar220 + auVar171._28_4_;
        auVar170 = vrcpps_avx(auVar134);
        fVar247 = auVar170._0_4_;
        fVar4 = auVar170._4_4_;
        auVar82._4_4_ = auVar134._4_4_ * fVar4;
        auVar82._0_4_ = auVar134._0_4_ * fVar247;
        fVar11 = auVar170._8_4_;
        auVar82._8_4_ = auVar134._8_4_ * fVar11;
        fVar12 = auVar170._12_4_;
        auVar82._12_4_ = auVar134._12_4_ * fVar12;
        fVar13 = auVar170._16_4_;
        auVar82._16_4_ = auVar134._16_4_ * fVar13;
        fVar14 = auVar170._20_4_;
        auVar82._20_4_ = auVar134._20_4_ * fVar14;
        fVar15 = auVar170._24_4_;
        auVar82._24_4_ = auVar134._24_4_ * fVar15;
        auVar82._28_4_ = auVar129._28_4_;
        auVar191._8_4_ = 0x3f800000;
        auVar191._0_8_ = 0x3f8000003f800000;
        auVar191._12_4_ = 0x3f800000;
        auVar191._16_4_ = 0x3f800000;
        auVar191._20_4_ = 0x3f800000;
        auVar191._24_4_ = 0x3f800000;
        auVar191._28_4_ = 0x3f800000;
        auVar129 = vsubps_avx(auVar191,auVar82);
        auVar145._0_4_ = (fVar127 + fVar127) * (fVar247 + fVar247 * auVar129._0_4_);
        auVar145._4_4_ = (fVar128 + fVar128) * (fVar4 + fVar4 * auVar129._4_4_);
        auVar145._8_4_ = (fVar213 + fVar213) * (fVar11 + fVar11 * auVar129._8_4_);
        auVar145._12_4_ = (fVar126 + fVar126) * (fVar12 + fVar12 * auVar129._12_4_);
        local_5e80._16_4_ = (fVar197 + fVar197) * (fVar13 + fVar13 * auVar129._16_4_);
        local_5e80._0_16_ = auVar145;
        local_5e80._20_4_ = (fVar121 + fVar121) * (fVar14 + fVar14 * auVar129._20_4_);
        local_5e80._24_4_ = (fVar122 + fVar122) * (fVar15 + fVar15 * auVar129._24_4_);
        local_5e80._28_4_ = fVar123 + fVar123;
        auVar129 = vcmpps_avx(local_5e80,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar170 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),local_5e80,2);
        auVar129 = vandps_avx(auVar170,auVar129);
        auVar170 = vcmpps_avx(auVar134,_DAT_01f7b000,4);
        auVar129 = vandps_avx(auVar170,auVar129);
        auVar146 = vpslld_avx(auVar129._0_16_,0x1f);
        auVar144 = vpsrad_avx(auVar146,0x1f);
        auVar146 = vpslld_avx(auVar129._16_16_,0x1f);
        auVar146 = vpsrad_avx(auVar146,0x1f);
        auVar135._16_16_ = auVar146;
        auVar135._0_16_ = auVar144;
        auVar129 = vandps_avx(auVar147,auVar169);
        auVar170 = auVar129 & auVar135;
        auVar251 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        local_5dc0 = auVar224;
        local_5da0 = auVar250;
        local_5d40 = auVar169;
        if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar170 >> 0x7f,0) == '\0') &&
              (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar170 >> 0xbf,0) == '\0') &&
            (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar170[0x1f]) {
          auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
        }
        else {
          auVar129 = vandps_avx(auVar135,auVar129);
          uVar6 = *(uint *)(lVar103 + lVar105);
          pGVar8 = (context->scene->geometries).items[uVar6].ptr;
          uVar5 = pGVar8->mask;
          auVar151._4_4_ = uVar5;
          auVar151._0_4_ = uVar5;
          auVar151._8_4_ = uVar5;
          auVar151._12_4_ = uVar5;
          auVar151._16_4_ = uVar5;
          auVar151._20_4_ = uVar5;
          auVar151._24_4_ = uVar5;
          auVar151._28_4_ = uVar5;
          auVar169 = vandps_avx(auVar151,*(undefined1 (*) [32])(ray + 0x120));
          auVar146 = vpcmpeqd_avx(auVar169._16_16_,ZEXT816(0) << 0x20);
          auVar144 = vpcmpeqd_avx(auVar169._0_16_,ZEXT816(0) << 0x20);
          auVar173._16_16_ = auVar146;
          auVar173._0_16_ = auVar145;
          auVar169 = vblendps_avx(ZEXT1632(auVar144),auVar173,0xf0);
          auVar170 = auVar129 & ~auVar169;
          auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
          unaff_R14 = local_6068;
          if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar170 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar170 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar170 >> 0x7f,0) != '\0') ||
                (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar170 >> 0xbf,0) != '\0') ||
              (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar170[0x1f] < '\0') {
            _auStack_601c = SUB3228(*(undefined1 (*) [32])pRVar1,4);
            local_6020 = (undefined1  [4])*(undefined4 *)(lVar103 + 0x10 + lVar105);
            auVar193 = vandnps_avx(auVar169,auVar129);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar147 = vrcpps_avx(auVar224);
              fVar247 = auVar147._0_4_;
              fVar4 = auVar147._4_4_;
              auVar86._4_4_ = auVar224._4_4_ * fVar4;
              auVar86._0_4_ = auVar224._0_4_ * fVar247;
              fVar11 = auVar147._8_4_;
              auVar86._8_4_ = auVar224._8_4_ * fVar11;
              fVar12 = auVar147._12_4_;
              auVar86._12_4_ = auVar224._12_4_ * fVar12;
              fVar13 = auVar147._16_4_;
              auVar86._16_4_ = auVar224._16_4_ * fVar13;
              fVar14 = auVar147._20_4_;
              auVar86._20_4_ = auVar224._20_4_ * fVar14;
              fVar15 = auVar147._24_4_;
              auVar86._24_4_ = auVar224._24_4_ * fVar15;
              auVar86._28_4_ = auVar224._28_4_;
              auVar174._8_4_ = 0x3f800000;
              auVar174._0_8_ = 0x3f8000003f800000;
              auVar174._12_4_ = 0x3f800000;
              auVar174._16_4_ = 0x3f800000;
              auVar174._20_4_ = 0x3f800000;
              auVar174._24_4_ = 0x3f800000;
              auVar174._28_4_ = 0x3f800000;
              auVar129 = vsubps_avx(auVar174,auVar86);
              auVar137._0_4_ = fVar247 + fVar247 * auVar129._0_4_;
              auVar137._4_4_ = fVar4 + fVar4 * auVar129._4_4_;
              auVar137._8_4_ = fVar11 + fVar11 * auVar129._8_4_;
              auVar137._12_4_ = fVar12 + fVar12 * auVar129._12_4_;
              auVar137._16_4_ = fVar13 + fVar13 * auVar129._16_4_;
              auVar137._20_4_ = fVar14 + fVar14 * auVar129._20_4_;
              auVar137._24_4_ = fVar15 + fVar15 * auVar129._24_4_;
              auVar137._28_4_ = auVar147._28_4_ + auVar129._28_4_;
              auVar153._8_4_ = 0x219392ef;
              auVar153._0_8_ = 0x219392ef219392ef;
              auVar153._12_4_ = 0x219392ef;
              auVar153._16_4_ = 0x219392ef;
              auVar153._20_4_ = 0x219392ef;
              auVar153._24_4_ = 0x219392ef;
              auVar153._28_4_ = 0x219392ef;
              auVar129 = vcmpps_avx(local_5d80,auVar153,5);
              auVar147 = vandps_avx(auVar129,auVar137);
              auVar87._4_4_ = auVar147._4_4_ * local_5d60._4_4_;
              auVar87._0_4_ = auVar147._0_4_ * local_5d60._0_4_;
              auVar87._8_4_ = auVar147._8_4_ * local_5d60._8_4_;
              auVar87._12_4_ = auVar147._12_4_ * local_5d60._12_4_;
              auVar87._16_4_ = auVar147._16_4_ * local_5d60._16_4_;
              auVar87._20_4_ = auVar147._20_4_ * local_5d60._20_4_;
              auVar87._24_4_ = auVar147._24_4_ * local_5d60._24_4_;
              auVar87._28_4_ = auVar129._28_4_;
              auVar129 = vminps_avx(auVar87,auVar174);
              auVar88._4_4_ = auVar147._4_4_ * auVar250._4_4_;
              auVar88._0_4_ = auVar147._0_4_ * auVar250._0_4_;
              auVar88._8_4_ = auVar147._8_4_ * auVar250._8_4_;
              auVar88._12_4_ = auVar147._12_4_ * auVar250._12_4_;
              auVar88._16_4_ = auVar147._16_4_ * auVar250._16_4_;
              auVar88._20_4_ = auVar147._20_4_ * auVar250._20_4_;
              auVar88._24_4_ = auVar147._24_4_ * auVar250._24_4_;
              auVar88._28_4_ = auVar147._28_4_;
              auVar147 = vminps_avx(auVar88,auVar174);
              auVar169 = vsubps_avx(auVar174,auVar129);
              auVar170 = vsubps_avx(auVar174,auVar147);
              auVar93._8_8_ = uStack_5998;
              auVar93._0_8_ = local_59a0;
              auVar93._16_8_ = uStack_5990;
              auVar93._24_8_ = uStack_5988;
              local_5e40 = vblendvps_avx(auVar129,auVar169,auVar93);
              local_5e60 = vblendvps_avx(auVar147,auVar170,auVar93);
              local_6060.valid = local_5be0;
              local_6060.geometryUserPtr = &local_5c40;
              local_6060.context = local_5c20;
              local_6060.ray = local_5c00;
              auVar200 = ZEXT1664(local_5ee0._64_16_);
              auVar225 = ZEXT1664(auVar199._0_16_);
              _local_5f80 = auVar193;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_6060,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_5ee0.field_0);
              pRVar9 = context->user;
              local_5e20 = vpshufd_avx(ZEXT416(uVar6),0);
              local_5e40._16_16_ =
                   vshufps_avx(ZEXT416((uint)local_6020),ZEXT416((uint)local_6020),0);
              auVar89._8_8_ = uStack_5bb8;
              auVar89._0_8_ = local_5bc0;
              auVar89._16_8_ = uStack_5bb0;
              auVar89._24_8_ = uStack_5ba8;
              auVar146 = local_5f80._0_16_;
              local_5e40._0_16_ = local_5e40._16_16_;
              auVar129 = vcmpps_avx(auVar89,auVar89,0xf);
              local_5fa8[1] = auVar129;
              *local_5fa8 = auVar129;
              local_5e00 = pRVar9->instID[0];
              local_5de0 = pRVar9->instPrimID[0];
              _local_6020 = *(undefined1 (*) [32])(ray + 0x100);
              auVar147 = vblendvps_avx(_local_6020,(undefined1  [32])local_5c40,_local_5f80);
              *(undefined1 (*) [32])(ray + 0x100) = auVar147;
              local_5fe0._0_32_ = _local_5f80;
              local_6060.valid = (int *)local_5fe0;
              local_6060.geometryUserPtr = pGVar8->userPtr;
              local_6060.context = context->user;
              local_6060.hit = (RTCHitN *)&local_5ee0;
              local_6060.N = 8;
              local_5e10 = local_5e20;
              uStack_5dfc = local_5e00;
              uStack_5df8 = local_5e00;
              uStack_5df4 = local_5e00;
              uStack_5df0 = local_5e00;
              uStack_5dec = local_5e00;
              uStack_5de8 = local_5e00;
              uStack_5de4 = local_5e00;
              uStack_5ddc = local_5de0;
              uStack_5dd8 = local_5de0;
              uStack_5dd4 = local_5de0;
              uStack_5dd0 = local_5de0;
              uStack_5dcc = local_5de0;
              uStack_5dc8 = local_5de0;
              uStack_5dc4 = local_5de0;
              if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
                auVar144 = local_5f80._16_16_;
                local_6060.ray = (RTCRayN *)ray;
              }
              else {
                auVar147 = ZEXT1632(auVar129._0_16_);
                auVar200 = ZEXT1664(auVar200._0_16_);
                auVar225 = ZEXT1664(auVar225._0_16_);
                local_6060.ray = (RTCRayN *)ray;
                (*pGVar8->occlusionFilterN)(&local_6060);
                auVar129 = vcmpps_avx(auVar147,auVar147,0xf);
                auVar144 = local_5fe0._16_16_;
                auVar146 = local_5fe0._0_16_;
              }
              unaff_R14 = local_6068;
              auVar145 = vpcmpeqd_avx(auVar146,(undefined1  [16])0x0);
              auVar16 = vpcmpeqd_avx(auVar144,(undefined1  [16])0x0);
              auVar139._16_16_ = auVar16;
              auVar139._0_16_ = auVar145;
              auVar129 = auVar129 & ~auVar139;
              auVar147 = vcmpps_avx(ZEXT1632(auVar16),ZEXT1632(auVar16),0xf);
              auVar251 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar129 >> 0x7f,0) == '\0') &&
                    (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar129 >> 0xbf,0) == '\0') &&
                  (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar129[0x1f]) {
                auVar193._0_4_ = auVar145._0_4_ ^ auVar147._0_4_;
                auVar193._4_4_ = auVar145._4_4_ ^ auVar147._4_4_;
                auVar193._8_4_ = auVar145._8_4_ ^ auVar147._8_4_;
                auVar193._12_4_ = auVar145._12_4_ ^ auVar147._12_4_;
                auVar193._16_4_ = auVar16._0_4_ ^ auVar147._16_4_;
                auVar193._20_4_ = auVar16._4_4_ ^ auVar147._20_4_;
                auVar193._24_4_ = auVar16._8_4_ ^ auVar147._24_4_;
                auVar193._28_4_ = auVar16._12_4_ ^ auVar147._28_4_;
              }
              else {
                p_Var10 = context->args->filter;
                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar200 = ZEXT1664(auVar200._0_16_);
                  auVar225 = ZEXT1664(auVar225._0_16_);
                  (*p_Var10)(&local_6060);
                  auVar256 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  auVar254 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar251 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar144 = local_5fe0._16_16_;
                  auVar146 = local_5fe0._0_16_;
                }
                auVar146 = vpcmpeqd_avx(auVar146,ZEXT816(0) << 0x40);
                auVar144 = vpcmpeqd_avx(auVar144,ZEXT816(0) << 0x40);
                auVar119._16_16_ = auVar144;
                auVar119._0_16_ = auVar146;
                auVar193._0_8_ = auVar146._0_8_ ^ 0xffffffffffffffff;
                auVar193._8_4_ = auVar146._8_4_ ^ 0xffffffff;
                auVar193._12_4_ = auVar146._12_4_ ^ 0xffffffff;
                auVar193._16_4_ = auVar144._0_4_ ^ 0xffffffff;
                auVar193._20_4_ = auVar144._4_4_ ^ 0xffffffff;
                auVar193._24_4_ = auVar144._8_4_ ^ 0xffffffff;
                auVar193._28_4_ = auVar144._12_4_ ^ 0xffffffff;
                auVar141._8_4_ = 0xff800000;
                auVar141._0_8_ = 0xff800000ff800000;
                auVar141._12_4_ = 0xff800000;
                auVar141._16_4_ = 0xff800000;
                auVar141._20_4_ = 0xff800000;
                auVar141._24_4_ = 0xff800000;
                auVar141._28_4_ = 0xff800000;
                auVar147 = vblendvps_avx(auVar141,*(undefined1 (*) [32])(local_6060.ray + 0x100),
                                         auVar119);
                *(undefined1 (*) [32])(local_6060.ray + 0x100) = auVar147;
              }
              auVar147 = vblendvps_avx(_local_6020,*(undefined1 (*) [32])local_6030,auVar193);
              *(undefined1 (*) [32])local_6030 = auVar147;
              lVar105 = local_5fa0;
              uVar108 = local_6070;
            }
            auVar147 = vandnps_avx(auVar193,local_6000);
            auVar129 = local_6000 & ~auVar193;
            auVar232 = ZEXT3264(auVar147);
            auVar156 = auVar232;
            if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar129 >> 0x7f,0) != '\0') ||
                  (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar129 >> 0xbf,0) != '\0') ||
                (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar129[0x1f] < '\0') goto LAB_0102d69a;
            goto LAB_0102def1;
          }
        }
        auVar156 = ZEXT3264(auVar147);
      }
LAB_0102d69a:
      lVar105 = lVar105 + 4;
      auVar232 = auVar156;
    }
    auVar251 = ZEXT3264(CONCAT428(0x7f800000,
                                  CONCAT424(0x7f800000,
                                            CONCAT420(0x7f800000,
                                                      CONCAT416(0x7f800000,
                                                                CONCAT412(0x7f800000,
                                                                          CONCAT48(0x7f800000,
                                                                                                                                                                      
                                                  0x7f8000007f800000)))))));
LAB_0102def1:
    auVar156 = ZEXT3264(local_5f20);
    auVar146 = local_5f20._0_16_;
    auVar129 = vandps_avx(auVar147,local_5f20);
    unaff_R14 = unaff_R14 + 1;
    lVar103 = lVar103 + 0x60;
    auVar147 = local_5f20 & auVar147;
    local_5f20 = auVar129;
  } while ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar147 >> 0x7f,0) != '\0') ||
             (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar147 >> 0xbf,0) != '\0') ||
           (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar147[0x1f] < '\0');
  auVar120._0_8_ = local_5f20._0_8_ ^ 0xffffffffffffffff;
  auVar120._8_4_ = local_5f20._8_4_ ^ 0xffffffff;
  auVar120._12_4_ = local_5f20._12_4_ ^ 0xffffffff;
  auVar120._16_4_ = local_5f20._16_4_ ^ 0xffffffff;
  auVar120._20_4_ = local_5f20._20_4_ ^ 0xffffffff;
  auVar120._24_4_ = local_5f20._24_4_ ^ 0xffffffff;
  auVar120._28_4_ = local_5f20._28_4_ ^ 0xffffffff;
  _local_5f60 = vorps_avx(auVar120,_local_5f60);
  auVar146 = vpcmpeqd_avx(auVar146,auVar146);
  auVar144 = vpcmpgtd_avx(local_5f60._16_16_,auVar146);
  auVar146 = vpcmpgtd_avx(local_5f60._0_16_,auVar146);
  auVar146 = vpor_avx(auVar146,auVar144);
  if ((((auVar146 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar146 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar146 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar146[0xf])
  goto LAB_0102e089;
  auVar154._8_4_ = 0xff800000;
  auVar154._0_8_ = 0xff800000ff800000;
  auVar154._12_4_ = 0xff800000;
  auVar154._16_4_ = 0xff800000;
  auVar154._20_4_ = 0xff800000;
  auVar154._24_4_ = 0xff800000;
  auVar154._28_4_ = 0xff800000;
  auVar156 = ZEXT3264(auVar154);
  local_59e0 = vblendvps_avx(local_59e0,auVar154,_local_5f60);
  goto LAB_0102c9ed;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }